

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [24];
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  __m128 _outp_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _p;
  __m256 _b_256;
  __m128 _b_128;
  int i;
  float b;
  binary_op_pow op;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_3;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_3;
  v4sf y_2;
  v4sf z_1;
  v4sf tmp_2;
  v4sf mask_2;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_2;
  v4si emm0;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2850;
  undefined8 uStack_2848;
  undefined8 local_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27b0;
  undefined8 uStack_27a8;
  int local_279c;
  float local_2798;
  undefined1 local_2791 [5];
  int local_278c;
  float *local_2788;
  undefined1 (*local_2778) [32];
  undefined1 (*local_2770) [32];
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  float *local_2738;
  undefined1 (*local_2730) [32];
  undefined8 local_2720;
  undefined8 uStack_2718;
  float *local_2708;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float local_26e4;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 *local_26c8;
  undefined8 *local_26c0;
  undefined1 *local_26b8;
  undefined8 *local_26b0;
  undefined8 *local_26a8;
  undefined1 *local_26a0;
  float *local_2698;
  undefined1 (*local_2690) [32];
  undefined1 *local_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined1 local_25c0 [32];
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [8];
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined1 local_2520 [8];
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined1 local_2380 [8];
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  float local_2360;
  float fStack_235c;
  float fStack_2358;
  float fStack_2354;
  float fStack_2350;
  float fStack_234c;
  float fStack_2348;
  float fStack_2344;
  undefined1 local_2340 [32];
  undefined1 local_2320 [32];
  undefined1 local_2300 [8];
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined1 local_22e0 [32];
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined1 local_2280 [8];
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined1 local_21a0 [32];
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined1 *local_1fd8;
  float *local_1fd0;
  undefined1 *local_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  float local_1fa0;
  float fStack_1f9c;
  float fStack_1f98;
  float fStack_1f94;
  float fStack_1f90;
  float fStack_1f8c;
  float fStack_1f88;
  undefined4 uStack_1f84;
  float local_1f80 [2];
  float afStack_1f78 [2];
  float afStack_1f70 [2];
  float afStack_1f68 [2];
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined1 *local_1f38;
  float *local_1f30;
  undefined1 *local_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  float local_1f00;
  float fStack_1efc;
  float fStack_1ef8;
  float fStack_1ef4;
  float fStack_1ef0;
  float fStack_1eec;
  float fStack_1ee8;
  undefined4 uStack_1ee4;
  float local_1ee0 [2];
  float afStack_1ed8 [2];
  float afStack_1ed0 [2];
  float afStack_1ec8 [2];
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  float *local_1e98;
  undefined1 *local_1e90;
  undefined1 *local_1e88;
  float local_1e80 [2];
  float afStack_1e78 [2];
  float afStack_1e70 [2];
  float afStack_1e68 [2];
  float local_1e60;
  float fStack_1e5c;
  float fStack_1e58;
  float fStack_1e54;
  float fStack_1e50;
  float fStack_1e4c;
  float fStack_1e48;
  float fStack_1e44;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  float *local_1df8;
  undefined1 *local_1df0;
  undefined1 *local_1de8;
  float local_1de0 [2];
  float afStack_1dd8 [2];
  float afStack_1dd0 [2];
  float afStack_1dc8 [2];
  float local_1dc0;
  float fStack_1dbc;
  float fStack_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  float fStack_1da8;
  float fStack_1da4;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  float *local_1d58;
  undefined1 *local_1d50;
  undefined1 *local_1d48;
  float local_1d40 [2];
  float afStack_1d38 [2];
  float afStack_1d30 [2];
  float afStack_1d28 [2];
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  float *local_1cb8;
  undefined1 *local_1cb0;
  undefined1 *local_1ca8;
  float local_1ca0 [2];
  float afStack_1c98 [2];
  float afStack_1c90 [2];
  float afStack_1c88 [2];
  float local_1c80;
  float fStack_1c7c;
  float fStack_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  float fStack_1c68;
  float fStack_1c64;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  float *local_1c18;
  undefined1 *local_1c10;
  undefined1 *local_1c08;
  float local_1c00 [2];
  float afStack_1bf8 [2];
  float afStack_1bf0 [2];
  float afStack_1be8 [2];
  float local_1be0;
  float fStack_1bdc;
  float fStack_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  float fStack_1bc8;
  float fStack_1bc4;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  float *local_1b78;
  undefined1 *local_1b70;
  undefined1 *local_1b68;
  float local_1b60 [2];
  float afStack_1b58 [2];
  float afStack_1b50 [2];
  float afStack_1b48 [2];
  float local_1b40;
  float fStack_1b3c;
  float fStack_1b38;
  float fStack_1b34;
  float fStack_1b30;
  float fStack_1b2c;
  float fStack_1b28;
  float fStack_1b24;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  float *local_1ad8;
  undefined1 *local_1ad0;
  undefined1 *local_1ac8;
  float local_1ac0 [2];
  float afStack_1ab8 [2];
  float afStack_1ab0 [2];
  float afStack_1aa8 [2];
  float local_1aa0;
  float fStack_1a9c;
  float fStack_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  float fStack_1a88;
  float fStack_1a84;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  float *local_1a38;
  undefined1 *local_1a30;
  undefined1 *local_1a28;
  float local_1a20 [2];
  float afStack_1a18 [2];
  float afStack_1a10 [2];
  float afStack_1a08 [2];
  float local_1a00;
  float fStack_19fc;
  float fStack_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  float fStack_19e8;
  float fStack_19e4;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined1 *local_1998;
  undefined8 *local_1990;
  undefined8 *local_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  float local_1960;
  float fStack_195c;
  float fStack_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  float fStack_1948;
  float fStack_1944;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  float *local_18f8;
  undefined1 *local_18f0;
  undefined8 *local_18e8;
  float local_18e0 [2];
  float afStack_18d8 [2];
  float afStack_18d0 [2];
  float afStack_18c8 [2];
  float local_18c0;
  float fStack_18bc;
  float fStack_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  float fStack_18a8;
  float fStack_18a4;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  float *local_1858;
  undefined1 *local_1850;
  undefined8 *local_1848;
  float local_1840 [2];
  float afStack_1838 [2];
  float afStack_1830 [2];
  float afStack_1828 [2];
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  float *local_17b8;
  undefined1 *local_17b0;
  undefined8 *local_17a8;
  float local_17a0 [2];
  float afStack_1798 [2];
  float afStack_1790 [2];
  float afStack_1788 [2];
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  float *local_1718;
  undefined1 *local_1710;
  undefined8 *local_1708;
  float local_1700 [2];
  float afStack_16f8 [2];
  float afStack_16f0 [2];
  float afStack_16e8 [2];
  float local_16e0;
  float fStack_16dc;
  float fStack_16d8;
  float fStack_16d4;
  float fStack_16d0;
  float fStack_16cc;
  float fStack_16c8;
  float fStack_16c4;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  float *local_1678;
  undefined1 *local_1670;
  undefined8 *local_1668;
  float local_1660 [2];
  float afStack_1658 [2];
  float afStack_1650 [2];
  float afStack_1648 [2];
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  float *local_15d8;
  float *local_15d0;
  undefined1 *local_15c8;
  float local_15c0 [2];
  float afStack_15b8 [2];
  float afStack_15b0 [2];
  float afStack_15a8 [2];
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  undefined4 uStack_1584;
  float local_1580 [2];
  float afStack_1578 [2];
  float afStack_1570 [2];
  float afStack_1568 [2];
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined1 *local_1438;
  float *local_1430;
  float *local_1428;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  float local_13e0 [2];
  float afStack_13d8 [2];
  float afStack_13d0 [2];
  float afStack_13c8 [2];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 *local_1398;
  float *local_1390;
  undefined1 *local_1388;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  float local_1340 [2];
  float afStack_1338 [2];
  float afStack_1330 [2];
  float afStack_1328 [2];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 *local_12f8;
  float *local_12f0;
  undefined1 *local_12e8;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  float local_12a0 [2];
  float afStack_1298 [2];
  float afStack_1290 [2];
  float afStack_1288 [2];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10d0 [16];
  undefined1 local_10c0 [16];
  undefined4 local_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 local_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 local_1030;
  undefined8 uStack_1028;
  undefined4 local_1014;
  undefined8 local_1010;
  undefined8 uStack_1008;
  undefined4 local_ff4;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined1 local_f70 [16];
  undefined1 local_f60 [16];
  undefined4 local_f44;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 local_df0;
  undefined8 uStack_de8;
  undefined1 local_de0 [16];
  undefined1 local_dd0 [16];
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined4 local_d54;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined4 local_d34;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [16];
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined1 local_c60 [16];
  undefined1 local_c50 [8];
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined1 local_c30 [8];
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined4 local_af4;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined1 local_ae0 [8];
  undefined8 uStack_ad8;
  float local_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [8];
  undefined8 uStack_a98;
  undefined1 local_a90 [16];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined1 local_a70 [16];
  undefined1 local_a60 [8];
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined1 local_9f0 [16];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined4 local_924;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined1 *local_7e8;
  float *local_7e0;
  float *local_7d8;
  float local_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  float local_7b0 [2];
  float afStack_7a8 [2];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined1 *local_788;
  float *local_780;
  undefined1 *local_778;
  float local_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  float local_750 [2];
  float afStack_748 [2];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined1 *local_728;
  float *local_720;
  undefined1 *local_718;
  float local_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  float local_6f0 [2];
  float afStack_6e8 [2];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined1 *local_6c8;
  float *local_6c0;
  undefined1 *local_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_690 [2];
  float afStack_688 [2];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined1 *local_668;
  float *local_660;
  undefined1 *local_658;
  undefined8 local_650;
  undefined8 uStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_630 [2];
  float afStack_628 [2];
  undefined8 local_620;
  undefined8 uStack_618;
  float *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  float local_5f0 [2];
  float afStack_5e8 [2];
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  float *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  float local_590 [2];
  float afStack_588 [2];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  float *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  float local_530 [2];
  float afStack_528 [2];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  float *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  float local_4d0 [2];
  float afStack_4c8 [2];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  float *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  float local_470 [2];
  float afStack_468 [2];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  float *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  float local_410 [2];
  float afStack_408 [2];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  float *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  float local_3b0 [2];
  float afStack_3a8 [2];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  float *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  float local_350 [2];
  float afStack_348 [2];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 *local_308;
  undefined8 *local_300;
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  float *local_2a8;
  undefined1 *local_2a0;
  undefined8 *local_298;
  float local_290 [2];
  float afStack_288 [2];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  float *local_248;
  undefined1 *local_240;
  undefined8 *local_238;
  float local_230 [2];
  float afStack_228 [2];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float *local_1e8;
  undefined1 *local_1e0;
  undefined8 *local_1d8;
  float local_1d0 [2];
  float afStack_1c8 [2];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float *local_188;
  undefined1 *local_180;
  undefined8 *local_178;
  float local_170 [2];
  float afStack_168 [2];
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  float *local_128;
  undefined1 *local_120;
  undefined8 *local_118;
  float local_110 [2];
  float afStack_108 [2];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_2798 = *in_RSI;
  local_279c = 0;
  if (in_R8D == 4) {
    local_2850 = *(undefined8 *)in_RSI;
    uStack_2848 = *(undefined8 *)(in_RSI + 2);
  }
  else {
    local_2850 = CONCAT44(local_2798,local_2798);
    uStack_2848 = CONCAT44(local_2798,local_2798);
    local_2700 = local_2798;
    fStack_26fc = local_2798;
    fStack_26f8 = local_2798;
    fStack_26f4 = local_2798;
    local_26e4 = local_2798;
  }
  local_27b0 = local_2850;
  uStack_27a8 = uStack_2848;
  if (in_R8D == 8) {
    local_2880 = *(undefined8 *)in_RSI;
    uStack_2878 = *(undefined8 *)(in_RSI + 2);
    uStack_2870 = *(undefined8 *)(in_RSI + 4);
    uStack_2868 = *(undefined8 *)(in_RSI + 6);
  }
  else {
    local_26e0 = local_2850;
    uStack_26d8 = uStack_2848;
    local_2880 = local_2850;
    uStack_2878 = uStack_2848;
    uStack_2870 = local_2850;
    uStack_2868 = uStack_2848;
  }
  local_27e0 = local_2880;
  uStack_27d8 = uStack_2878;
  uStack_27d0 = uStack_2870;
  uStack_27c8 = uStack_2868;
  local_2788 = in_RDX;
  local_2778 = in_RDI;
  for (; local_279c + 7 < in_ECX; local_279c = local_279c + 8) {
    local_2770 = local_2778;
    local_2800 = *(undefined8 *)*local_2778;
    uStack_27f8 = *(undefined8 *)(*local_2778 + 8);
    uStack_27f0 = *(undefined8 *)(*local_2778 + 0x10);
    uStack_27e8 = *(undefined8 *)(*local_2778 + 0x18);
    local_26b8 = local_2791;
    local_26c0 = &local_2800;
    local_26c8 = &local_27e0;
    local_2680 = local_2880;
    uStack_2678 = uStack_2878;
    uStack_2670 = uStack_2870;
    uStack_2668 = uStack_2868;
    local_25a0 = 0x3f8000003f800000;
    uStack_2598 = 0x3f8000003f800000;
    uStack_2590 = 0x3f8000003f800000;
    uStack_2588 = 0x3f8000003f800000;
    local_2020 = 0;
    uStack_2018 = 0;
    uStack_2010 = 0;
    uStack_2008 = 0;
    local_22e0 = vcmpps_avx(*local_2778,ZEXT1632(ZEXT816(0)),2);
    local_2280 = SUB168(*(undefined1 (*) [16])*local_2778,0);
    local_2040 = local_2280;
    uStack_2278 = SUB168(*(undefined1 (*) [16])*local_2778,8);
    uStack_2038 = uStack_2278;
    local_2060 = 0x80000000800000;
    uStack_2058 = 0x80000000800000;
    uStack_2050 = 0x80000000800000;
    uStack_2048 = 0x80000000800000;
    auVar25._8_8_ = 0x80000000800000;
    auVar25._0_8_ = 0x80000000800000;
    auVar25._16_8_ = 0x80000000800000;
    auVar25._24_8_ = 0x80000000800000;
    auVar2 = vmaxps_avx(*local_2778,auVar25);
    local_2280 = auVar2._0_8_;
    local_f20 = local_2280;
    uStack_2278 = auVar2._8_8_;
    uStack_f18 = uStack_2278;
    uStack_2270 = auVar2._16_8_;
    uStack_f10 = uStack_2270;
    uStack_2268 = auVar2._24_8_;
    uStack_f08 = uStack_2268;
    local_f40 = local_2280;
    uStack_f38 = uStack_2278;
    uStack_f30 = uStack_2270;
    uStack_f28 = uStack_2268;
    local_f44 = 0x17;
    local_fc0 = local_2280;
    uStack_fb8 = uStack_2278;
    uStack_fb0 = uStack_2270;
    uStack_fa8 = uStack_2268;
    local_d30 = local_2280;
    uStack_d28 = uStack_2278;
    local_d34 = 0x17;
    local_f60 = vpsrld_avx(auVar2._0_16_,ZEXT416(0x17));
    local_d50 = uStack_2270;
    uStack_d48 = uStack_2268;
    local_d54 = 0x17;
    local_f70 = vpsrld_avx(auVar2._16_16_,ZEXT416(0x17));
    local_fe0 = local_f60._0_8_;
    uStack_fd8 = local_f60._8_8_;
    uStack_fd0 = local_f70._0_8_;
    uStack_fc8 = local_f70._8_8_;
    local_fa0 = local_f60._0_8_;
    uStack_f98 = local_f60._8_8_;
    uStack_f90 = local_f70._0_8_;
    uStack_f88 = local_f70._8_8_;
    local_14a0 = local_2280;
    uStack_1498 = uStack_2278;
    uStack_1490 = uStack_2270;
    uStack_1488 = uStack_2268;
    local_14c0 = 0x807fffff807fffff;
    uStack_14b8 = 0x807fffff807fffff;
    uStack_14b0 = 0x807fffff807fffff;
    uStack_14a8 = 0x807fffff807fffff;
    auVar27._8_8_ = 0x807fffff807fffff;
    auVar27._0_8_ = 0x807fffff807fffff;
    auVar27._16_8_ = 0x807fffff807fffff;
    auVar27._24_8_ = 0x807fffff807fffff;
    auVar2 = vandps_avx(auVar2,auVar27);
    local_2280 = auVar2._0_8_;
    local_ea0 = local_2280;
    uStack_2278 = auVar2._8_8_;
    uStack_e98 = uStack_2278;
    uStack_2270 = auVar2._16_8_;
    uStack_e90 = uStack_2270;
    uStack_2268 = auVar2._24_8_;
    uStack_e88 = uStack_2268;
    local_ec0 = 0x3f0000003f000000;
    uStack_eb8 = 0x3f0000003f000000;
    uStack_eb0 = 0x3f0000003f000000;
    uStack_ea8 = 0x3f0000003f000000;
    auVar34._8_8_ = 0x3f0000003f000000;
    auVar34._0_8_ = 0x3f0000003f000000;
    auVar34._16_8_ = 0x3f0000003f000000;
    auVar34._24_8_ = 0x3f0000003f000000;
    auVar3 = vorps_avx(auVar2,auVar34);
    local_da0 = local_f60._0_8_;
    uStack_d98 = local_f60._8_8_;
    uStack_d90 = local_f70._0_8_;
    uStack_d88 = local_f70._8_8_;
    local_1180 = 0x7f0000007f;
    uStack_1178 = 0x7f0000007f;
    uStack_1170 = 0x7f0000007f;
    uStack_1168 = 0x7f0000007f;
    local_e40 = local_f60._0_8_;
    uStack_e38 = local_f60._8_8_;
    uStack_e30 = local_f70._0_8_;
    uStack_e28 = local_f70._8_8_;
    local_e60 = 0x7f0000007f;
    uStack_e58 = 0x7f0000007f;
    uStack_e50 = 0x7f0000007f;
    uStack_e48 = 0x7f0000007f;
    local_df0 = 0x7f0000007f;
    uStack_de8 = 0x7f0000007f;
    local_e00 = 0x7f0000007f;
    uStack_df8 = 0x7f0000007f;
    local_cf0 = local_f60._0_8_;
    uStack_ce8 = local_f60._8_8_;
    local_d00 = 0x7f0000007f;
    uStack_cf8 = 0x7f0000007f;
    auVar37._8_8_ = 0x7f0000007f;
    auVar37._0_8_ = 0x7f0000007f;
    local_dd0 = vpsubd_avx(local_f60,auVar37);
    local_d10 = local_f70._0_8_;
    uStack_d08 = local_f70._8_8_;
    local_d20 = 0x7f0000007f;
    uStack_d18 = 0x7f0000007f;
    auVar36._8_8_ = 0x7f0000007f;
    auVar36._0_8_ = 0x7f0000007f;
    local_de0 = vpsubd_avx(local_f70,auVar36);
    local_e80 = local_dd0._0_8_;
    uStack_e78 = local_dd0._8_8_;
    uStack_e70 = local_de0._0_8_;
    uStack_e68 = local_de0._8_8_;
    local_e20 = local_dd0._0_8_;
    uStack_e18 = local_dd0._8_8_;
    uStack_e10 = local_de0._0_8_;
    uStack_e08 = local_de0._8_8_;
    local_22a0 = local_dd0._0_8_;
    uStack_2298 = local_dd0._8_8_;
    uStack_2290 = local_de0._0_8_;
    uStack_2288 = local_de0._8_8_;
    local_d80 = local_dd0._0_8_;
    uStack_d78 = local_dd0._8_8_;
    uStack_d70 = local_de0._0_8_;
    uStack_d68 = local_de0._8_8_;
    auVar35._16_8_ = local_de0._0_8_;
    auVar35._0_16_ = local_dd0;
    auVar35._24_8_ = local_de0._8_8_;
    auVar2 = vcvtdq2ps_avx(auVar35);
    local_2300 = auVar2._0_8_;
    uVar7 = local_2300;
    uStack_22f8 = auVar2._8_8_;
    uVar8 = uStack_22f8;
    uStack_22f0 = auVar2._16_8_;
    uVar9 = uStack_22f0;
    uStack_22e8 = auVar2._24_8_;
    uVar10 = uStack_22e8;
    local_21e0 = 0x3f8000003f800000;
    uStack_21d8 = 0x3f8000003f800000;
    uStack_21d0 = 0x3f8000003f800000;
    uStack_21c8 = 0x3f8000003f800000;
    local_21c0._0_4_ = auVar2._0_4_;
    local_21c0._4_4_ = auVar2._4_4_;
    uStack_21b8._0_4_ = auVar2._8_4_;
    uStack_21b8._4_4_ = auVar2._12_4_;
    uStack_21b0._0_4_ = auVar2._16_4_;
    uStack_21b0._4_4_ = auVar2._20_4_;
    uStack_21a8._0_4_ = auVar2._24_4_;
    uStack_21a8._4_4_ = auVar2._28_4_;
    local_2300._4_4_ = local_21c0._4_4_ + 1.0;
    local_2300._0_4_ = (float)local_21c0 + 1.0;
    uStack_22f8._0_4_ = (float)uStack_21b8 + 1.0;
    uStack_22f8._4_4_ = uStack_21b8._4_4_ + 1.0;
    uStack_22f0._0_4_ = (float)uStack_21b0 + 1.0;
    uStack_22f0._4_4_ = uStack_21b0._4_4_ + 1.0;
    auVar58 = _local_2300;
    uStack_22e8._0_4_ = (float)uStack_21a8 + 1.0;
    uStack_22e8._4_4_ = uStack_21a8._4_4_ + 1.0;
    auVar6 = _local_2300;
    local_2320 = vcmpps_avx(auVar3,_DAT_01fd2f60,1);
    local_2280 = auVar3._0_8_;
    local_14e0 = local_2280;
    uStack_2278 = auVar3._8_8_;
    uStack_14d8 = uStack_2278;
    uStack_2270 = auVar3._16_8_;
    uStack_14d0 = uStack_2270;
    uStack_2268 = auVar3._24_8_;
    uStack_14c8 = uStack_2268;
    local_1500 = local_2320._0_8_;
    uStack_14f8 = local_2320._8_8_;
    uStack_14f0 = local_2320._16_8_;
    uStack_14e8 = local_2320._24_8_;
    local_2340 = vandps_avx(auVar3,local_2320);
    local_2140 = local_2280;
    uStack_2138 = uStack_2278;
    uStack_2130 = uStack_2270;
    uStack_2128 = uStack_2268;
    local_2160 = 0x3f8000003f800000;
    uStack_2158 = 0x3f8000003f800000;
    uStack_2150 = 0x3f8000003f800000;
    uStack_2148 = 0x3f8000003f800000;
    auVar24._8_8_ = 0x3f8000003f800000;
    auVar24._0_8_ = 0x3f8000003f800000;
    auVar24._16_8_ = 0x3f8000003f800000;
    auVar24._24_8_ = 0x3f8000003f800000;
    auVar2 = vsubps_avx(auVar3,auVar24);
    local_2180 = local_2300;
    uStack_2178 = uStack_22f8;
    uStack_22f0 = auVar58._16_8_;
    uStack_2170 = uStack_22f0;
    uStack_22e8 = auVar6._24_8_;
    uStack_2168 = uStack_22e8;
    local_1520 = 0x3f8000003f800000;
    uStack_1518 = 0x3f8000003f800000;
    uStack_1510 = 0x3f8000003f800000;
    uStack_1508 = 0x3f8000003f800000;
    local_1540 = local_2320._0_8_;
    uStack_1538 = local_2320._8_8_;
    uStack_1530 = local_2320._16_8_;
    uStack_1528 = local_2320._24_8_;
    auVar26._8_8_ = 0x3f8000003f800000;
    auVar26._0_8_ = 0x3f8000003f800000;
    auVar26._16_8_ = 0x3f8000003f800000;
    auVar26._24_8_ = 0x3f8000003f800000;
    local_21a0 = vandps_avx(auVar26,local_2320);
    auVar23._16_8_ = uStack_22f0;
    auVar23._0_16_ = _local_2300;
    auVar23._24_8_ = uStack_22e8;
    _local_2300 = vsubps_avx(auVar23,local_21a0);
    local_2280 = auVar2._0_8_;
    uVar11 = local_2280;
    uStack_2278 = auVar2._8_8_;
    uVar12 = uStack_2278;
    uStack_2270 = auVar2._16_8_;
    uVar13 = uStack_2270;
    uStack_2268 = auVar2._24_8_;
    uVar14 = uStack_2268;
    local_2200._0_4_ = auVar2._0_4_;
    local_2200._4_4_ = auVar2._4_4_;
    uStack_21f8._0_4_ = auVar2._8_4_;
    uStack_21f8._4_4_ = auVar2._12_4_;
    uStack_21f0._0_4_ = auVar2._16_4_;
    uStack_21f0._4_4_ = auVar2._20_4_;
    uStack_21e8._0_4_ = auVar2._24_4_;
    uStack_21e8._4_4_ = auVar2._28_4_;
    local_2220._0_4_ = local_2340._0_4_;
    local_2220._4_4_ = local_2340._4_4_;
    uStack_2218._0_4_ = local_2340._8_4_;
    uStack_2218._4_4_ = local_2340._12_4_;
    uStack_2210._0_4_ = local_2340._16_4_;
    uStack_2210._4_4_ = local_2340._20_4_;
    uStack_2208._0_4_ = local_2340._24_4_;
    uStack_2208._4_4_ = local_2340._28_4_;
    local_2200._0_4_ = (float)local_2200 + (float)local_2220;
    local_2200._4_4_ = local_2200._4_4_ + local_2220._4_4_;
    uStack_21f8._0_4_ = (float)uStack_21f8 + (float)uStack_2218;
    uStack_21f8._4_4_ = uStack_21f8._4_4_ + uStack_2218._4_4_;
    uStack_21f0._0_4_ = (float)uStack_21f0 + (float)uStack_2210;
    uStack_21f0._4_4_ = uStack_21f0._4_4_ + uStack_2210._4_4_;
    uStack_21e8._0_4_ = (float)uStack_21e8 + (float)uStack_2208;
    fStack_2344 = uStack_21e8._4_4_ + uStack_2208._4_4_;
    local_2280._4_4_ = local_2200._4_4_;
    local_2280._0_4_ = (float)local_2200;
    uStack_2278._0_4_ = (float)uStack_21f8;
    uStack_2278._4_4_ = uStack_21f8._4_4_;
    uStack_2270._0_4_ = (float)uStack_21f0;
    uStack_2270._4_4_ = uStack_21f0._4_4_;
    auVar58 = _local_2280;
    uStack_2268._0_4_ = (float)uStack_21e8;
    uStack_2268._4_4_ = fStack_2344;
    auVar2 = _local_2280;
    local_20a0 = local_2280;
    uStack_2098 = uStack_2278;
    uStack_2270 = auVar58._16_8_;
    uStack_2090 = uStack_2270;
    uStack_2268 = auVar2._24_8_;
    uStack_2088 = uStack_2268;
    local_2360 = (float)local_2200 * (float)local_2200;
    fStack_235c = local_2200._4_4_ * local_2200._4_4_;
    fStack_2358 = (float)uStack_21f8 * (float)uStack_21f8;
    fStack_2354 = uStack_21f8._4_4_ * uStack_21f8._4_4_;
    fStack_2350 = (float)uStack_21f0 * (float)uStack_21f0;
    fStack_234c = uStack_21f0._4_4_ * uStack_21f0._4_4_;
    fStack_2348 = (float)uStack_21e8 * (float)uStack_21e8;
    local_1f38 = local_2380;
    local_1fd8 = local_2280;
    local_1a38 = ::_ps256_cephes_log_p1;
    local_19c0 = 0x3d9021bb3d9021bb;
    uStack_19b8 = 0x3d9021bb3d9021bb;
    uStack_19b0 = 0x3d9021bb3d9021bb;
    uStack_19a8 = 0x3d9021bb3d9021bb;
    local_19e0 = local_2280;
    uStack_19d8 = uStack_2278;
    uStack_19d0 = uStack_2270;
    uStack_19c8 = uStack_2268;
    local_1a00 = (float)local_2200 * 0.070376836;
    fStack_19fc = local_2200._4_4_ * 0.070376836;
    fStack_19f8 = (float)uStack_21f8 * 0.070376836;
    fStack_19f4 = uStack_21f8._4_4_ * 0.070376836;
    fStack_19f0 = (float)uStack_21f0 * 0.070376836;
    fStack_19ec = uStack_21f0._4_4_ * 0.070376836;
    fStack_19e8 = (float)uStack_21e8 * 0.070376836;
    local_1a20[0] = -0.1151461;
    local_1a20[1] = -0.1151461;
    afStack_1a18[0] = -0.1151461;
    afStack_1a18[1] = -0.1151461;
    afStack_1a10[0] = -0.1151461;
    afStack_1a10[1] = -0.1151461;
    afStack_1a08[0] = -0.1151461;
    afStack_1a08[1] = -0.1151461;
    local_2380._4_4_ = fStack_19fc + -0.1151461;
    local_2380._0_4_ = local_1a00 + -0.1151461;
    uStack_2378._0_4_ = fStack_19f8 + -0.1151461;
    uStack_2378._4_4_ = fStack_19f4 + -0.1151461;
    uStack_2370._0_4_ = fStack_19f0 + -0.1151461;
    uStack_2370._4_4_ = fStack_19ec + -0.1151461;
    auVar58 = _local_2380;
    uStack_2368._0_4_ = fStack_19e8 + -0.1151461;
    uStack_2368._4_4_ = fStack_2344 + -0.1151461;
    auVar2 = _local_2380;
    local_1ad8 = ::_ps256_cephes_log_p2;
    local_1a60 = local_2380;
    uStack_1a58 = uStack_2378;
    uStack_2370 = auVar58._16_8_;
    uStack_1a50 = uStack_2370;
    uStack_2368 = auVar2._24_8_;
    uStack_1a48 = uStack_2368;
    local_1a80 = local_2280;
    uStack_1a78 = uStack_2278;
    uStack_1a70 = uStack_2270;
    uStack_1a68 = uStack_2268;
    local_1aa0 = (local_1a00 + -0.1151461) * (float)local_2200;
    fStack_1a9c = (fStack_19fc + -0.1151461) * local_2200._4_4_;
    fStack_1a98 = (fStack_19f8 + -0.1151461) * (float)uStack_21f8;
    fStack_1a94 = (fStack_19f4 + -0.1151461) * uStack_21f8._4_4_;
    fStack_1a90 = (fStack_19f0 + -0.1151461) * (float)uStack_21f0;
    fStack_1a8c = (fStack_19ec + -0.1151461) * uStack_21f0._4_4_;
    fStack_1a88 = (fStack_19e8 + -0.1151461) * (float)uStack_21e8;
    local_1ac0[0] = 0.116769984;
    local_1ac0[1] = 0.116769984;
    afStack_1ab8[0] = 0.116769984;
    afStack_1ab8[1] = 0.116769984;
    afStack_1ab0[0] = 0.116769984;
    afStack_1ab0[1] = 0.116769984;
    afStack_1aa8[0] = 0.116769984;
    afStack_1aa8[1] = 0.116769984;
    local_2380._4_4_ = fStack_1a9c + 0.116769984;
    local_2380._0_4_ = local_1aa0 + 0.116769984;
    uStack_2378._0_4_ = fStack_1a98 + 0.116769984;
    uStack_2378._4_4_ = fStack_1a94 + 0.116769984;
    uStack_2370._0_4_ = fStack_1a90 + 0.116769984;
    uStack_2370._4_4_ = fStack_1a8c + 0.116769984;
    auVar58 = _local_2380;
    uStack_2368._0_4_ = fStack_1a88 + 0.116769984;
    uStack_2368._4_4_ = fStack_2344 + 0.116769984;
    auVar2 = _local_2380;
    local_1b78 = ::_ps256_cephes_log_p3;
    local_1b00 = local_2380;
    uStack_1af8 = uStack_2378;
    uStack_2370 = auVar58._16_8_;
    uStack_1af0 = uStack_2370;
    uStack_2368 = auVar2._24_8_;
    uStack_1ae8 = uStack_2368;
    local_1b20 = local_2280;
    uStack_1b18 = uStack_2278;
    uStack_1b10 = uStack_2270;
    uStack_1b08 = uStack_2268;
    local_1b40 = (local_1aa0 + 0.116769984) * (float)local_2200;
    fStack_1b3c = (fStack_1a9c + 0.116769984) * local_2200._4_4_;
    fStack_1b38 = (fStack_1a98 + 0.116769984) * (float)uStack_21f8;
    fStack_1b34 = (fStack_1a94 + 0.116769984) * uStack_21f8._4_4_;
    fStack_1b30 = (fStack_1a90 + 0.116769984) * (float)uStack_21f0;
    fStack_1b2c = (fStack_1a8c + 0.116769984) * uStack_21f0._4_4_;
    fStack_1b28 = (fStack_1a88 + 0.116769984) * (float)uStack_21e8;
    local_1b60[0] = -0.12420141;
    local_1b60[1] = -0.12420141;
    afStack_1b58[0] = -0.12420141;
    afStack_1b58[1] = -0.12420141;
    afStack_1b50[0] = -0.12420141;
    afStack_1b50[1] = -0.12420141;
    afStack_1b48[0] = -0.12420141;
    afStack_1b48[1] = -0.12420141;
    local_2380._4_4_ = fStack_1b3c + -0.12420141;
    local_2380._0_4_ = local_1b40 + -0.12420141;
    uStack_2378._0_4_ = fStack_1b38 + -0.12420141;
    uStack_2378._4_4_ = fStack_1b34 + -0.12420141;
    uStack_2370._0_4_ = fStack_1b30 + -0.12420141;
    uStack_2370._4_4_ = fStack_1b2c + -0.12420141;
    auVar58 = _local_2380;
    uStack_2368._0_4_ = fStack_1b28 + -0.12420141;
    uStack_2368._4_4_ = fStack_2344 + -0.12420141;
    auVar2 = _local_2380;
    local_1c18 = ::_ps256_cephes_log_p4;
    local_1ba0 = local_2380;
    uStack_1b98 = uStack_2378;
    uStack_2370 = auVar58._16_8_;
    uStack_1b90 = uStack_2370;
    uStack_2368 = auVar2._24_8_;
    uStack_1b88 = uStack_2368;
    local_1bc0 = local_2280;
    uStack_1bb8 = uStack_2278;
    uStack_1bb0 = uStack_2270;
    uStack_1ba8 = uStack_2268;
    local_1be0 = (local_1b40 + -0.12420141) * (float)local_2200;
    fStack_1bdc = (fStack_1b3c + -0.12420141) * local_2200._4_4_;
    fStack_1bd8 = (fStack_1b38 + -0.12420141) * (float)uStack_21f8;
    fStack_1bd4 = (fStack_1b34 + -0.12420141) * uStack_21f8._4_4_;
    fStack_1bd0 = (fStack_1b30 + -0.12420141) * (float)uStack_21f0;
    fStack_1bcc = (fStack_1b2c + -0.12420141) * uStack_21f0._4_4_;
    fStack_1bc8 = (fStack_1b28 + -0.12420141) * (float)uStack_21e8;
    local_1c00[0] = 0.14249323;
    local_1c00[1] = 0.14249323;
    afStack_1bf8[0] = 0.14249323;
    afStack_1bf8[1] = 0.14249323;
    afStack_1bf0[0] = 0.14249323;
    afStack_1bf0[1] = 0.14249323;
    afStack_1be8[0] = 0.14249323;
    afStack_1be8[1] = 0.14249323;
    local_2380._4_4_ = fStack_1bdc + 0.14249323;
    local_2380._0_4_ = local_1be0 + 0.14249323;
    uStack_2378._0_4_ = fStack_1bd8 + 0.14249323;
    uStack_2378._4_4_ = fStack_1bd4 + 0.14249323;
    uStack_2370._0_4_ = fStack_1bd0 + 0.14249323;
    uStack_2370._4_4_ = fStack_1bcc + 0.14249323;
    auVar58 = _local_2380;
    uStack_2368._0_4_ = fStack_1bc8 + 0.14249323;
    uStack_2368._4_4_ = fStack_2344 + 0.14249323;
    auVar2 = _local_2380;
    local_1cb8 = ::_ps256_cephes_log_p5;
    local_1c40 = local_2380;
    uStack_1c38 = uStack_2378;
    uStack_2370 = auVar58._16_8_;
    uStack_1c30 = uStack_2370;
    uStack_2368 = auVar2._24_8_;
    uStack_1c28 = uStack_2368;
    local_1c60 = local_2280;
    uStack_1c58 = uStack_2278;
    uStack_1c50 = uStack_2270;
    uStack_1c48 = uStack_2268;
    local_1c80 = (local_1be0 + 0.14249323) * (float)local_2200;
    fStack_1c7c = (fStack_1bdc + 0.14249323) * local_2200._4_4_;
    fStack_1c78 = (fStack_1bd8 + 0.14249323) * (float)uStack_21f8;
    fStack_1c74 = (fStack_1bd4 + 0.14249323) * uStack_21f8._4_4_;
    fStack_1c70 = (fStack_1bd0 + 0.14249323) * (float)uStack_21f0;
    fStack_1c6c = (fStack_1bcc + 0.14249323) * uStack_21f0._4_4_;
    fStack_1c68 = (fStack_1bc8 + 0.14249323) * (float)uStack_21e8;
    local_1ca0[0] = -0.16668057;
    local_1ca0[1] = -0.16668057;
    afStack_1c98[0] = -0.16668057;
    afStack_1c98[1] = -0.16668057;
    afStack_1c90[0] = -0.16668057;
    afStack_1c90[1] = -0.16668057;
    afStack_1c88[0] = -0.16668057;
    afStack_1c88[1] = -0.16668057;
    local_2380._4_4_ = fStack_1c7c + -0.16668057;
    local_2380._0_4_ = local_1c80 + -0.16668057;
    uStack_2378._0_4_ = fStack_1c78 + -0.16668057;
    uStack_2378._4_4_ = fStack_1c74 + -0.16668057;
    uStack_2370._0_4_ = fStack_1c70 + -0.16668057;
    uStack_2370._4_4_ = fStack_1c6c + -0.16668057;
    auVar58 = _local_2380;
    uStack_2368._0_4_ = fStack_1c68 + -0.16668057;
    uStack_2368._4_4_ = fStack_2344 + -0.16668057;
    auVar2 = _local_2380;
    local_1d58 = ::_ps256_cephes_log_p6;
    local_1ce0 = local_2380;
    uStack_1cd8 = uStack_2378;
    uStack_2370 = auVar58._16_8_;
    uStack_1cd0 = uStack_2370;
    uStack_2368 = auVar2._24_8_;
    uStack_1cc8 = uStack_2368;
    local_1d00 = local_2280;
    uStack_1cf8 = uStack_2278;
    uStack_1cf0 = uStack_2270;
    uStack_1ce8 = uStack_2268;
    local_1d20 = (local_1c80 + -0.16668057) * (float)local_2200;
    fStack_1d1c = (fStack_1c7c + -0.16668057) * local_2200._4_4_;
    fStack_1d18 = (fStack_1c78 + -0.16668057) * (float)uStack_21f8;
    fStack_1d14 = (fStack_1c74 + -0.16668057) * uStack_21f8._4_4_;
    fStack_1d10 = (fStack_1c70 + -0.16668057) * (float)uStack_21f0;
    fStack_1d0c = (fStack_1c6c + -0.16668057) * uStack_21f0._4_4_;
    fStack_1d08 = (fStack_1c68 + -0.16668057) * (float)uStack_21e8;
    local_1d40[0] = 0.20000714;
    local_1d40[1] = 0.20000714;
    afStack_1d38[0] = 0.20000714;
    afStack_1d38[1] = 0.20000714;
    afStack_1d30[0] = 0.20000714;
    afStack_1d30[1] = 0.20000714;
    afStack_1d28[0] = 0.20000714;
    afStack_1d28[1] = 0.20000714;
    local_2380._4_4_ = fStack_1d1c + 0.20000714;
    local_2380._0_4_ = local_1d20 + 0.20000714;
    uStack_2378._0_4_ = fStack_1d18 + 0.20000714;
    uStack_2378._4_4_ = fStack_1d14 + 0.20000714;
    uStack_2370._0_4_ = fStack_1d10 + 0.20000714;
    uStack_2370._4_4_ = fStack_1d0c + 0.20000714;
    auVar58 = _local_2380;
    uStack_2368._0_4_ = fStack_1d08 + 0.20000714;
    uStack_2368._4_4_ = fStack_2344 + 0.20000714;
    auVar2 = _local_2380;
    local_1df8 = ::_ps256_cephes_log_p7;
    local_1d80 = local_2380;
    uStack_1d78 = uStack_2378;
    uStack_2370 = auVar58._16_8_;
    uStack_1d70 = uStack_2370;
    uStack_2368 = auVar2._24_8_;
    uStack_1d68 = uStack_2368;
    local_1da0 = local_2280;
    uStack_1d98 = uStack_2278;
    uStack_1d90 = uStack_2270;
    uStack_1d88 = uStack_2268;
    local_1dc0 = (local_1d20 + 0.20000714) * (float)local_2200;
    fStack_1dbc = (fStack_1d1c + 0.20000714) * local_2200._4_4_;
    fStack_1db8 = (fStack_1d18 + 0.20000714) * (float)uStack_21f8;
    fStack_1db4 = (fStack_1d14 + 0.20000714) * uStack_21f8._4_4_;
    fStack_1db0 = (fStack_1d10 + 0.20000714) * (float)uStack_21f0;
    fStack_1dac = (fStack_1d0c + 0.20000714) * uStack_21f0._4_4_;
    fStack_1da8 = (fStack_1d08 + 0.20000714) * (float)uStack_21e8;
    local_1de0[0] = -0.24999994;
    local_1de0[1] = -0.24999994;
    afStack_1dd8[0] = -0.24999994;
    afStack_1dd8[1] = -0.24999994;
    afStack_1dd0[0] = -0.24999994;
    afStack_1dd0[1] = -0.24999994;
    afStack_1dc8[0] = -0.24999994;
    afStack_1dc8[1] = -0.24999994;
    local_2380._4_4_ = fStack_1dbc + -0.24999994;
    local_2380._0_4_ = local_1dc0 + -0.24999994;
    uStack_2378._0_4_ = fStack_1db8 + -0.24999994;
    uStack_2378._4_4_ = fStack_1db4 + -0.24999994;
    uStack_2370._0_4_ = fStack_1db0 + -0.24999994;
    uStack_2370._4_4_ = fStack_1dac + -0.24999994;
    auVar58 = _local_2380;
    uStack_2368._0_4_ = fStack_1da8 + -0.24999994;
    uStack_2368._4_4_ = fStack_2344 + -0.24999994;
    auVar2 = _local_2380;
    local_1e98 = ::_ps256_cephes_log_p8;
    local_1e20 = local_2380;
    uStack_1e18 = uStack_2378;
    uStack_2370 = auVar58._16_8_;
    uStack_1e10 = uStack_2370;
    uStack_2368 = auVar2._24_8_;
    uStack_1e08 = uStack_2368;
    local_1e40 = local_2280;
    uStack_1e38 = uStack_2278;
    uStack_1e30 = uStack_2270;
    uStack_1e28 = uStack_2268;
    local_1e60 = (local_1dc0 + -0.24999994) * (float)local_2200;
    fStack_1e5c = (fStack_1dbc + -0.24999994) * local_2200._4_4_;
    fStack_1e58 = (fStack_1db8 + -0.24999994) * (float)uStack_21f8;
    fStack_1e54 = (fStack_1db4 + -0.24999994) * uStack_21f8._4_4_;
    fStack_1e50 = (fStack_1db0 + -0.24999994) * (float)uStack_21f0;
    fStack_1e4c = (fStack_1dac + -0.24999994) * uStack_21f0._4_4_;
    fStack_1e48 = (fStack_1da8 + -0.24999994) * (float)uStack_21e8;
    local_1e80[0] = 0.3333333;
    local_1e80[1] = 0.3333333;
    afStack_1e78[0] = 0.3333333;
    afStack_1e78[1] = 0.3333333;
    afStack_1e70[0] = 0.3333333;
    afStack_1e70[1] = 0.3333333;
    afStack_1e68[0] = 0.3333333;
    afStack_1e68[1] = 0.3333333;
    fVar66 = fStack_2344 + 0.3333333;
    local_2380._4_4_ = fStack_1e5c + 0.3333333;
    local_2380._0_4_ = local_1e60 + 0.3333333;
    uStack_2378._0_4_ = fStack_1e58 + 0.3333333;
    uStack_2378._4_4_ = fStack_1e54 + 0.3333333;
    uStack_2370._0_4_ = fStack_1e50 + 0.3333333;
    uStack_2370._4_4_ = fStack_1e4c + 0.3333333;
    auVar58 = _local_2380;
    uStack_2368._0_4_ = fStack_1e48 + 0.3333333;
    uStack_2368._4_4_ = fVar66;
    auVar2 = _local_2380;
    local_20c0 = local_2380;
    uStack_20b8 = uStack_2378;
    uStack_2370 = auVar58._16_8_;
    uStack_20b0 = uStack_2370;
    uStack_2368 = auVar2._24_8_;
    uStack_20a8 = uStack_2368;
    local_20e0 = local_2280;
    uStack_20d8 = uStack_2278;
    uStack_20d0 = uStack_2270;
    uStack_20c8 = uStack_2268;
    local_2380._0_4_ = (local_1e60 + 0.3333333) * (float)local_2200;
    local_2380._4_4_ = (fStack_1e5c + 0.3333333) * local_2200._4_4_;
    fVar61 = (fStack_1e58 + 0.3333333) * (float)uStack_21f8;
    fVar62 = (fStack_1e54 + 0.3333333) * uStack_21f8._4_4_;
    fVar63 = (fStack_1e50 + 0.3333333) * (float)uStack_21f0;
    fVar64 = (fStack_1e4c + 0.3333333) * uStack_21f0._4_4_;
    fVar65 = (fStack_1e48 + 0.3333333) * (float)uStack_21e8;
    uStack_2378._0_4_ = fVar61;
    uStack_2378._4_4_ = fVar62;
    uStack_2370._0_4_ = fVar63;
    uStack_2370._4_4_ = fVar64;
    auVar58 = _local_2380;
    uStack_2368._0_4_ = fVar65;
    auVar2 = _local_2380;
    local_2100 = local_2380;
    uStack_20f8 = uStack_2378;
    uStack_2370 = auVar58._16_8_;
    uStack_20f0 = uStack_2370;
    uStack_2368 = auVar2._24_8_;
    uStack_20e8 = uStack_2368;
    local_2120 = CONCAT44(fStack_235c,local_2360);
    uStack_2118 = CONCAT44(fStack_2354,fStack_2358);
    uStack_2110 = CONCAT44(fStack_234c,fStack_2350);
    uStack_2108 = CONCAT44(fStack_2344,fStack_2348);
    local_2380._0_4_ = (float)local_2380._0_4_ * local_2360;
    local_2380._4_4_ = (float)local_2380._4_4_ * fStack_235c;
    fVar61 = fVar61 * fStack_2358;
    fVar62 = fVar62 * fStack_2354;
    fVar63 = fVar63 * fStack_2350;
    fVar64 = fVar64 * fStack_234c;
    fVar65 = fVar65 * fStack_2348;
    uStack_2378._0_4_ = fVar61;
    uStack_2378._4_4_ = fVar62;
    uStack_2370._0_4_ = fVar63;
    uStack_2370._4_4_ = fVar64;
    auVar58 = _local_2380;
    uStack_2368._0_4_ = fVar65;
    auVar2 = _local_2380;
    local_1fc8 = local_2300;
    local_1f30 = ::_ps256_cephes_log_q1;
    local_1ee0[0] = -0.00021219444;
    local_1ee0[1] = -0.00021219444;
    afStack_1ed8[0] = -0.00021219444;
    afStack_1ed8[1] = -0.00021219444;
    afStack_1ed0[0] = -0.00021219444;
    afStack_1ed0[1] = -0.00021219444;
    afStack_1ec8[0] = -0.00021219444;
    afStack_1ec8[1] = -0.00021219444;
    local_1ec0._0_4_ = local_2300._0_4_;
    local_1ec0._4_4_ = local_2300._4_4_;
    uStack_1eb8._0_4_ = local_2300._8_4_;
    uStack_1eb8._4_4_ = local_2300._12_4_;
    uStack_1eb0._0_4_ = local_2300._16_4_;
    uStack_1eb0._4_4_ = local_2300._20_4_;
    uStack_1ea8._0_4_ = local_2300._24_4_;
    uStack_1ee4 = 0xb95e8083;
    local_1f00 = (float)local_1ec0 * -0.00021219444;
    fStack_1efc = local_1ec0._4_4_ * -0.00021219444;
    fStack_1ef8 = (float)uStack_1eb8 * -0.00021219444;
    fStack_1ef4 = uStack_1eb8._4_4_ * -0.00021219444;
    fStack_1ef0 = (float)uStack_1eb0 * -0.00021219444;
    fStack_1eec = uStack_1eb0._4_4_ * -0.00021219444;
    fStack_1ee8 = (float)uStack_1ea8 * -0.00021219444;
    local_1f20 = local_2380;
    uStack_1f18 = uStack_2378;
    uStack_2370 = auVar58._16_8_;
    uStack_1f10 = uStack_2370;
    uStack_2368 = auVar2._24_8_;
    uStack_1f08 = uStack_2368;
    local_2380._4_4_ = fStack_1efc + (float)local_2380._4_4_;
    local_2380._0_4_ = local_1f00 + (float)local_2380._0_4_;
    uStack_2378._0_4_ = fStack_1ef8 + fVar61;
    uStack_2378._4_4_ = fStack_1ef4 + fVar62;
    uStack_2370._0_4_ = fStack_1ef0 + fVar63;
    uStack_2370._4_4_ = fStack_1eec + fVar64;
    auVar58 = _local_2380;
    uStack_2368._0_4_ = fStack_1ee8 + fVar65;
    uStack_2368._4_4_ = fVar66 + -0.00021219444;
    auVar2 = _local_2380;
    local_1428 = &local_2360;
    local_1430 = ::_ps256_0p5;
    local_1400 = local_2380;
    uStack_13f8 = uStack_2378;
    uStack_2370 = auVar58._16_8_;
    uStack_13f0 = uStack_2370;
    uStack_2368 = auVar2._24_8_;
    uStack_13e8 = uStack_2368;
    local_13c0 = CONCAT44(fStack_235c,local_2360);
    uStack_13b8 = CONCAT44(fStack_2354,fStack_2358);
    uStack_13b0 = CONCAT44(fStack_234c,fStack_2350);
    uStack_13a8 = CONCAT44(fStack_2344,fStack_2348);
    local_13e0[0] = 0.5;
    local_13e0[1] = 0.5;
    afStack_13d8[0] = 0.5;
    afStack_13d8[1] = 0.5;
    afStack_13d0[0] = 0.5;
    afStack_13d0[1] = 0.5;
    afStack_13c8[0] = 0.5;
    afStack_13c8[1] = 0.5;
    local_1420 = local_2360 * 0.5;
    fStack_141c = fStack_235c * 0.5;
    fStack_1418 = fStack_2358 * 0.5;
    fStack_1414 = fStack_2354 * 0.5;
    fStack_1410 = fStack_2350 * 0.5;
    fStack_140c = fStack_234c * 0.5;
    fStack_1408 = fStack_2348 * 0.5;
    auVar29._4_4_ = fStack_141c;
    auVar29._0_4_ = local_1420;
    auVar29._8_4_ = fStack_1418;
    auVar29._12_4_ = fStack_1414;
    auVar29._16_4_ = fStack_1410;
    auVar29._20_4_ = fStack_140c;
    auVar29._24_4_ = fStack_1408;
    auVar29._28_4_ = fStack_2344;
    auVar2 = vsubps_avx(auVar2,auVar29);
    local_2240 = local_2280;
    uStack_2238 = uStack_2278;
    uStack_2230 = uStack_2270;
    uStack_2228 = uStack_2268;
    local_2380 = auVar2._0_8_;
    uVar15 = local_2380;
    uStack_2378 = auVar2._8_8_;
    uVar16 = uStack_2378;
    uStack_2370 = auVar2._16_8_;
    uVar17 = uStack_2370;
    uStack_2368 = auVar2._24_8_;
    uVar18 = uStack_2368;
    local_2260._0_4_ = auVar2._0_4_;
    local_2260._4_4_ = auVar2._4_4_;
    uStack_2258._0_4_ = auVar2._8_4_;
    uStack_2258._4_4_ = auVar2._12_4_;
    uStack_2250._0_4_ = auVar2._16_4_;
    uStack_2250._4_4_ = auVar2._20_4_;
    uStack_2248._0_4_ = auVar2._24_4_;
    uStack_2248._4_4_ = auVar2._28_4_;
    local_2280._4_4_ = local_2200._4_4_ + local_2260._4_4_;
    local_2280._0_4_ = (float)local_2200 + (float)local_2260;
    uStack_2278._0_4_ = (float)uStack_21f8 + (float)uStack_2258;
    uStack_2278._4_4_ = uStack_21f8._4_4_ + uStack_2258._4_4_;
    uStack_2270._0_4_ = (float)uStack_21f0 + (float)uStack_2250;
    uStack_2270._4_4_ = uStack_21f0._4_4_ + uStack_2250._4_4_;
    auVar58 = _local_2280;
    uStack_2268._0_4_ = (float)uStack_21e8 + (float)uStack_2248;
    uStack_2268._4_4_ = fStack_2344 + uStack_2248._4_4_;
    auVar2 = _local_2280;
    local_1fd0 = ::_ps256_cephes_log_q2;
    local_1f60 = local_2300;
    uStack_1f58 = uStack_22f8;
    uStack_1f50 = uStack_22f0;
    uStack_1f48 = uStack_22e8;
    local_1f80[0] = 0.6933594;
    local_1f80[1] = 0.6933594;
    afStack_1f78[0] = 0.6933594;
    afStack_1f78[1] = 0.6933594;
    afStack_1f70[0] = 0.6933594;
    afStack_1f70[1] = 0.6933594;
    afStack_1f68[0] = 0.6933594;
    afStack_1f68[1] = 0.6933594;
    uStack_1f84 = 0x3f318000;
    local_1fa0 = (float)local_1ec0 * 0.6933594;
    fStack_1f9c = local_1ec0._4_4_ * 0.6933594;
    fStack_1f98 = (float)uStack_1eb8 * 0.6933594;
    fStack_1f94 = uStack_1eb8._4_4_ * 0.6933594;
    fStack_1f90 = (float)uStack_1eb0 * 0.6933594;
    fStack_1f8c = uStack_1eb0._4_4_ * 0.6933594;
    fStack_1f88 = (float)uStack_1ea8 * 0.6933594;
    local_1fc0 = local_2280;
    uStack_1fb8 = uStack_2278;
    uStack_2270 = auVar58._16_8_;
    uStack_1fb0 = uStack_2270;
    uStack_2268 = auVar2._24_8_;
    uStack_1fa8 = uStack_2268;
    local_2280._4_4_ = fStack_1f9c + local_2200._4_4_ + local_2260._4_4_;
    local_2280._0_4_ = local_1fa0 + (float)local_2200 + (float)local_2260;
    uStack_2278._0_4_ = fStack_1f98 + (float)uStack_21f8 + (float)uStack_2258;
    uStack_2278._4_4_ = fStack_1f94 + uStack_21f8._4_4_ + uStack_2258._4_4_;
    uStack_2270._0_4_ = fStack_1f90 + (float)uStack_21f0 + (float)uStack_2250;
    uStack_2270._4_4_ = fStack_1f8c + uStack_21f0._4_4_ + uStack_2250._4_4_;
    auVar58 = _local_2280;
    uStack_2268._0_4_ = fStack_1f88 + (float)uStack_21e8 + (float)uStack_2248;
    uStack_2268._4_4_ = fStack_2344 + uStack_2248._4_4_ + 0.6933594;
    auVar23 = _local_2280;
    local_ee0 = local_2280;
    uStack_ed8 = uStack_2278;
    uStack_2270 = auVar58._16_8_;
    uStack_ed0 = uStack_2270;
    uStack_2268 = auVar23._24_8_;
    uStack_ec8 = uStack_2268;
    local_f00 = local_22e0._0_8_;
    uStack_ef8 = local_22e0._8_8_;
    uStack_ef0 = local_22e0._16_8_;
    uStack_ee8 = local_22e0._24_8_;
    auVar33._16_8_ = uStack_2270;
    auVar33._0_16_ = _local_2280;
    auVar33._24_8_ = uStack_2268;
    _local_2380 = vorps_avx(auVar33,local_22e0);
    local_2620._0_4_ = (float)local_2880;
    local_2620._4_4_ = (float)((ulong)local_2880 >> 0x20);
    uStack_2618._0_4_ = (float)uStack_2878;
    uStack_2618._4_4_ = (float)((ulong)uStack_2878 >> 0x20);
    uStack_2610._0_4_ = (float)uStack_2870;
    uStack_2610._4_4_ = (float)((ulong)uStack_2870 >> 0x20);
    uStack_2608._0_4_ = (float)uStack_2868;
    uStack_2608._4_4_ = (undefined4)((ulong)uStack_2868 >> 0x20);
    local_2640._0_4_ = local_2380._0_4_;
    local_2640._4_4_ = local_2380._4_4_;
    uStack_2638._0_4_ = local_2380._8_4_;
    uStack_2638._4_4_ = local_2380._12_4_;
    uStack_2630._0_4_ = local_2380._16_4_;
    uStack_2630._4_4_ = local_2380._20_4_;
    uStack_2628._0_4_ = local_2380._24_4_;
    local_2520._4_4_ = local_2620._4_4_ * local_2640._4_4_;
    local_2520._0_4_ = (float)local_2620 * (float)local_2640;
    uStack_2518._0_4_ = (float)uStack_2618 * (float)uStack_2638;
    uStack_2518._4_4_ = uStack_2618._4_4_ * uStack_2638._4_4_;
    uStack_2510._0_4_ = (float)uStack_2610 * (float)uStack_2630;
    uStack_2510._4_4_ = uStack_2610._4_4_ * uStack_2630._4_4_;
    auVar58 = _local_2520;
    uStack_2508._0_4_ = (float)uStack_2608 * (float)uStack_2628;
    uStack_2508._4_4_ = uStack_2608._4_4_;
    auVar2 = _local_2520;
    local_2000 = 0;
    uStack_1ff8 = 0;
    uStack_1ff0 = 0;
    uStack_1fe8 = 0;
    local_23a0 = local_2520;
    uStack_2398 = uStack_2518;
    uStack_2510 = auVar58._16_8_;
    uStack_2390 = uStack_2510;
    uStack_2508 = auVar2._24_8_;
    uStack_2388 = uStack_2508;
    local_23c0 = 0x42b0c0a542b0c0a5;
    uStack_23b8 = 0x42b0c0a542b0c0a5;
    uStack_23b0 = 0x42b0c0a542b0c0a5;
    uStack_23a8 = 0x42b0c0a542b0c0a5;
    auVar6._16_8_ = uStack_2510;
    auVar6._0_16_ = _local_2520;
    auVar6._24_8_ = uStack_2508;
    auVar2._8_8_ = 0x42b0c0a542b0c0a5;
    auVar2._0_8_ = 0x42b0c0a542b0c0a5;
    auVar2._16_8_ = 0x42b0c0a542b0c0a5;
    auVar2._24_8_ = 0x42b0c0a542b0c0a5;
    auVar2 = vminps_avx(auVar6,auVar2);
    local_2520 = auVar2._0_8_;
    local_23e0 = local_2520;
    uStack_2518 = auVar2._8_8_;
    uStack_23d8 = uStack_2518;
    uStack_2510 = auVar2._16_8_;
    uStack_23d0 = uStack_2510;
    uStack_2508 = auVar2._24_8_;
    uStack_23c8 = uStack_2508;
    local_2400 = 0xc2b0c0a5c2b0c0a5;
    uStack_23f8 = 0xc2b0c0a5c2b0c0a5;
    uStack_23f0 = 0xc2b0c0a5c2b0c0a5;
    uStack_23e8 = 0xc2b0c0a5c2b0c0a5;
    auVar3._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3._16_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3._24_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar3 = vmaxps_avx(auVar2,auVar3);
    local_1998 = local_2520;
    local_15d0 = ::_ps256_cephes_LOG2EF;
    local_15d8 = ::_ps256_0p5;
    local_2520 = auVar3._0_8_;
    uVar19 = local_2520;
    uStack_2518 = auVar3._8_8_;
    uVar20 = uStack_2518;
    uStack_2510 = auVar3._16_8_;
    uVar21 = uStack_2510;
    uStack_2508 = auVar3._24_8_;
    uVar22 = uStack_2508;
    local_1580[0] = 1.442695;
    local_1580[1] = 1.442695;
    afStack_1578[0] = 1.442695;
    afStack_1578[1] = 1.442695;
    afStack_1570[0] = 1.442695;
    afStack_1570[1] = 1.442695;
    afStack_1568[0] = 1.442695;
    afStack_1568[1] = 1.442695;
    local_1560._0_4_ = auVar3._0_4_;
    local_1560._4_4_ = auVar3._4_4_;
    uStack_1558._0_4_ = auVar3._8_4_;
    uStack_1558._4_4_ = auVar3._12_4_;
    uStack_1550._0_4_ = auVar3._16_4_;
    uStack_1550._4_4_ = auVar3._20_4_;
    uStack_1548._0_4_ = auVar3._24_4_;
    uStack_1584 = 0x3fb8aa3b;
    local_15a0 = (float)local_1560 * 1.442695;
    fStack_159c = local_1560._4_4_ * 1.442695;
    fStack_1598 = (float)uStack_1558 * 1.442695;
    fStack_1594 = uStack_1558._4_4_ * 1.442695;
    fStack_1590 = (float)uStack_1550 * 1.442695;
    fStack_158c = uStack_1550._4_4_ * 1.442695;
    fStack_1588 = (float)uStack_1548 * 1.442695;
    local_15c0[0] = 0.5;
    local_15c0[1] = 0.5;
    afStack_15b8[0] = 0.5;
    afStack_15b8[1] = 0.5;
    afStack_15b0[0] = 0.5;
    afStack_15b0[1] = 0.5;
    afStack_15a8[0] = 0.5;
    afStack_15a8[1] = 0.5;
    local_2560._4_4_ = fStack_159c + 0.5;
    local_2560._0_4_ = local_15a0 + 0.5;
    uStack_2558._0_4_ = fStack_1598 + 0.5;
    uStack_2558._4_4_ = fStack_1594 + 0.5;
    uStack_2550._0_4_ = fStack_1590 + 0.5;
    uStack_2550._4_4_ = fStack_158c + 0.5;
    uStack_2548._0_4_ = fStack_1588 + 0.5;
    uStack_2548._4_4_ = 0x3ff8aa3b;
    auVar6 = vroundps_avx(_local_2560,1);
    auVar2 = vcmpps_avx(_local_2560,auVar6,1);
    local_25c0._0_8_ = auVar2._0_8_;
    local_1460 = local_25c0._0_8_;
    local_25c0._8_8_ = auVar2._8_8_;
    uStack_1458 = local_25c0._8_8_;
    local_25c0._16_8_ = auVar2._16_8_;
    uStack_1450 = local_25c0._16_8_;
    local_25c0._24_8_ = auVar2._24_8_;
    uStack_1448 = local_25c0._24_8_;
    local_1480 = 0x3f8000003f800000;
    uStack_1478 = 0x3f8000003f800000;
    uStack_1470 = 0x3f8000003f800000;
    uStack_1468 = 0x3f8000003f800000;
    auVar28._8_8_ = 0x3f8000003f800000;
    auVar28._0_8_ = 0x3f8000003f800000;
    auVar28._16_8_ = 0x3f8000003f800000;
    auVar28._24_8_ = 0x3f8000003f800000;
    local_25c0 = vandps_avx(auVar2,auVar28);
    local_2540 = auVar6._0_8_;
    local_24a0 = local_2540;
    uStack_2538 = auVar6._8_8_;
    uStack_2498 = uStack_2538;
    uStack_2530 = auVar6._16_8_;
    uStack_2490 = uStack_2530;
    uStack_2528 = auVar6._24_8_;
    uStack_2488 = uStack_2528;
    local_24c0 = local_25c0._0_8_;
    uStack_24b8 = local_25c0._8_8_;
    uStack_24b0 = local_25c0._16_8_;
    uStack_24a8 = local_25c0._24_8_;
    _local_2560 = vsubps_avx(auVar6,local_25c0);
    local_1388 = local_2560;
    local_12f0 = ::_ps256_cephes_exp_C1;
    local_12c0 = local_2520;
    uStack_12b8 = uStack_2518;
    uStack_12b0 = uStack_2510;
    uStack_12a8 = uStack_2508;
    local_12a0[0] = 0.6933594;
    local_12a0[1] = 0.6933594;
    afStack_1298[0] = 0.6933594;
    afStack_1298[1] = 0.6933594;
    afStack_1290[0] = 0.6933594;
    afStack_1290[1] = 0.6933594;
    afStack_1288[0] = 0.6933594;
    afStack_1288[1] = 0.6933594;
    local_1280._0_4_ = local_2560._0_4_;
    local_1280._4_4_ = local_2560._4_4_;
    uStack_1278._0_4_ = local_2560._8_4_;
    uStack_1278._4_4_ = local_2560._12_4_;
    uStack_1270._0_4_ = local_2560._16_4_;
    uStack_1270._4_4_ = local_2560._20_4_;
    uStack_1268._0_4_ = local_2560._24_4_;
    uStack_1268._4_4_ = local_2560._28_4_;
    fStack_12c4 = uStack_1268._4_4_;
    local_12e0 = (float)local_1280 * 0.6933594;
    fStack_12dc = local_1280._4_4_ * 0.6933594;
    fStack_12d8 = (float)uStack_1278 * 0.6933594;
    fStack_12d4 = uStack_1278._4_4_ * 0.6933594;
    fStack_12d0 = (float)uStack_1270 * 0.6933594;
    fStack_12cc = uStack_1270._4_4_ * 0.6933594;
    fStack_12c8 = (float)uStack_1268 * 0.6933594;
    auVar31._4_4_ = fStack_12dc;
    auVar31._0_4_ = local_12e0;
    auVar31._8_4_ = fStack_12d8;
    auVar31._12_4_ = fStack_12d4;
    auVar31._16_4_ = fStack_12d0;
    auVar31._20_4_ = fStack_12cc;
    auVar31._24_4_ = fStack_12c8;
    auVar31._28_4_ = uStack_1268._4_4_;
    auVar2 = vsubps_avx(auVar3,auVar31);
    local_1390 = ::_ps256_cephes_exp_C2;
    local_2520 = auVar2._0_8_;
    local_1360 = local_2520;
    uStack_2518 = auVar2._8_8_;
    uStack_1358 = uStack_2518;
    uStack_2510 = auVar2._16_8_;
    uStack_1350 = uStack_2510;
    uStack_2508 = auVar2._24_8_;
    uStack_1348 = uStack_2508;
    local_1320 = local_2560;
    uStack_1318 = uStack_2558;
    uStack_1310 = uStack_2550;
    uStack_1308 = uStack_2548;
    local_1340[0] = -0.00021219444;
    local_1340[1] = -0.00021219444;
    afStack_1338[0] = -0.00021219444;
    afStack_1338[1] = -0.00021219444;
    afStack_1330[0] = -0.00021219444;
    afStack_1330[1] = -0.00021219444;
    afStack_1328[0] = -0.00021219444;
    afStack_1328[1] = -0.00021219444;
    fStack_1364 = uStack_1268._4_4_;
    local_1380 = (float)local_1280 * -0.00021219444;
    fStack_137c = local_1280._4_4_ * -0.00021219444;
    fStack_1378 = (float)uStack_1278 * -0.00021219444;
    fStack_1374 = uStack_1278._4_4_ * -0.00021219444;
    fStack_1370 = (float)uStack_1270 * -0.00021219444;
    fStack_136c = uStack_1270._4_4_ * -0.00021219444;
    fStack_1368 = (float)uStack_1268 * -0.00021219444;
    auVar30._4_4_ = fStack_137c;
    auVar30._0_4_ = local_1380;
    auVar30._8_4_ = fStack_1378;
    auVar30._12_4_ = fStack_1374;
    auVar30._16_4_ = fStack_1370;
    auVar30._20_4_ = fStack_136c;
    auVar30._24_4_ = fStack_1368;
    auVar30._28_4_ = uStack_1268._4_4_;
    _local_2520 = vsubps_avx(auVar2,auVar30);
    local_2440 = local_2520;
    uStack_2438 = uStack_2518;
    uStack_2430 = uStack_2510;
    uStack_2428 = uStack_2508;
    local_2420._0_4_ = local_2520._0_4_;
    local_2420._4_4_ = local_2520._4_4_;
    uStack_2418._0_4_ = local_2520._8_4_;
    uStack_2418._4_4_ = local_2520._12_4_;
    uStack_2410._0_4_ = local_2520._16_4_;
    uStack_2410._4_4_ = local_2520._20_4_;
    uStack_2408._0_4_ = local_2520._24_4_;
    uStack_2408._4_4_ = local_2520._28_4_;
    local_2540 = CONCAT44(local_2420._4_4_ * local_2420._4_4_,(float)local_2420 * (float)local_2420)
    ;
    uStack_2538._0_4_ = (float)uStack_2418 * (float)uStack_2418;
    uStack_2538._4_4_ = uStack_2418._4_4_ * uStack_2418._4_4_;
    uStack_2530._0_4_ = (float)uStack_2410 * (float)uStack_2410;
    uStack_2530._4_4_ = uStack_2410._4_4_ * uStack_2410._4_4_;
    auVar58 = _local_2540;
    uStack_2528._0_4_ = (float)uStack_2408 * (float)uStack_2408;
    uStack_2528._4_4_ = uStack_2408._4_4_;
    auVar2 = _local_2540;
    local_1988 = &local_25e0;
    local_1678 = ::_ps256_cephes_exp_p1;
    local_1600 = 0x3950696739506967;
    uStack_15f8 = 0x3950696739506967;
    uStack_15f0 = 0x3950696739506967;
    uStack_15e8 = 0x3950696739506967;
    local_1620 = local_2520;
    uStack_1618 = uStack_2518;
    uStack_1610 = uStack_2510;
    uStack_1608 = uStack_2508;
    fStack_1624 = uStack_2408._4_4_;
    local_1640 = (float)local_2420 * 0.00019875691;
    fStack_163c = local_2420._4_4_ * 0.00019875691;
    fStack_1638 = (float)uStack_2418 * 0.00019875691;
    fStack_1634 = uStack_2418._4_4_ * 0.00019875691;
    fStack_1630 = (float)uStack_2410 * 0.00019875691;
    fStack_162c = uStack_2410._4_4_ * 0.00019875691;
    fStack_1628 = (float)uStack_2408 * 0.00019875691;
    local_1660[0] = 0.0013981999;
    local_1660[1] = 0.0013981999;
    afStack_1658[0] = 0.0013981999;
    afStack_1658[1] = 0.0013981999;
    afStack_1650[0] = 0.0013981999;
    afStack_1650[1] = 0.0013981999;
    afStack_1648[0] = 0.0013981999;
    afStack_1648[1] = 0.0013981999;
    local_25e0 = CONCAT44(fStack_163c + 0.0013981999,local_1640 + 0.0013981999);
    uStack_25d8 = CONCAT44(fStack_1634 + 0.0013981999,fStack_1638 + 0.0013981999);
    uStack_25d0 = CONCAT44(fStack_162c + 0.0013981999,fStack_1630 + 0.0013981999);
    uStack_25c8 = CONCAT44(uStack_2408._4_4_ + 0.0013981999,fStack_1628 + 0.0013981999);
    local_1718 = ::_ps256_cephes_exp_p2;
    local_16a0 = local_25e0;
    uStack_1698 = uStack_25d8;
    uStack_1690 = uStack_25d0;
    uStack_1688 = uStack_25c8;
    local_16c0 = local_2520;
    uStack_16b8 = uStack_2518;
    uStack_16b0 = uStack_2510;
    uStack_16a8 = uStack_2508;
    fStack_16c4 = uStack_2408._4_4_;
    local_16e0 = (local_1640 + 0.0013981999) * (float)local_2420;
    fStack_16dc = (fStack_163c + 0.0013981999) * local_2420._4_4_;
    fStack_16d8 = (fStack_1638 + 0.0013981999) * (float)uStack_2418;
    fStack_16d4 = (fStack_1634 + 0.0013981999) * uStack_2418._4_4_;
    fStack_16d0 = (fStack_1630 + 0.0013981999) * (float)uStack_2410;
    fStack_16cc = (fStack_162c + 0.0013981999) * uStack_2410._4_4_;
    fStack_16c8 = (fStack_1628 + 0.0013981999) * (float)uStack_2408;
    local_1700[0] = 0.008333452;
    local_1700[1] = 0.008333452;
    afStack_16f8[0] = 0.008333452;
    afStack_16f8[1] = 0.008333452;
    afStack_16f0[0] = 0.008333452;
    afStack_16f0[1] = 0.008333452;
    afStack_16e8[0] = 0.008333452;
    afStack_16e8[1] = 0.008333452;
    local_25e0 = CONCAT44(fStack_16dc + 0.008333452,local_16e0 + 0.008333452);
    uStack_25d8 = CONCAT44(fStack_16d4 + 0.008333452,fStack_16d8 + 0.008333452);
    uStack_25d0 = CONCAT44(fStack_16cc + 0.008333452,fStack_16d0 + 0.008333452);
    uStack_25c8 = CONCAT44(uStack_2408._4_4_ + 0.008333452,fStack_16c8 + 0.008333452);
    local_17b8 = ::_ps256_cephes_exp_p3;
    local_1740 = local_25e0;
    uStack_1738 = uStack_25d8;
    uStack_1730 = uStack_25d0;
    uStack_1728 = uStack_25c8;
    local_1760 = local_2520;
    uStack_1758 = uStack_2518;
    uStack_1750 = uStack_2510;
    uStack_1748 = uStack_2508;
    fStack_1764 = uStack_2408._4_4_;
    local_1780 = (local_16e0 + 0.008333452) * (float)local_2420;
    fStack_177c = (fStack_16dc + 0.008333452) * local_2420._4_4_;
    fStack_1778 = (fStack_16d8 + 0.008333452) * (float)uStack_2418;
    fStack_1774 = (fStack_16d4 + 0.008333452) * uStack_2418._4_4_;
    fStack_1770 = (fStack_16d0 + 0.008333452) * (float)uStack_2410;
    fStack_176c = (fStack_16cc + 0.008333452) * uStack_2410._4_4_;
    fStack_1768 = (fStack_16c8 + 0.008333452) * (float)uStack_2408;
    local_17a0[0] = 0.041665796;
    local_17a0[1] = 0.041665796;
    afStack_1798[0] = 0.041665796;
    afStack_1798[1] = 0.041665796;
    afStack_1790[0] = 0.041665796;
    afStack_1790[1] = 0.041665796;
    afStack_1788[0] = 0.041665796;
    afStack_1788[1] = 0.041665796;
    local_25e0 = CONCAT44(fStack_177c + 0.041665796,local_1780 + 0.041665796);
    uStack_25d8 = CONCAT44(fStack_1774 + 0.041665796,fStack_1778 + 0.041665796);
    uStack_25d0 = CONCAT44(fStack_176c + 0.041665796,fStack_1770 + 0.041665796);
    uStack_25c8 = CONCAT44(uStack_2408._4_4_ + 0.041665796,fStack_1768 + 0.041665796);
    local_1858 = ::_ps256_cephes_exp_p4;
    local_17e0 = local_25e0;
    uStack_17d8 = uStack_25d8;
    uStack_17d0 = uStack_25d0;
    uStack_17c8 = uStack_25c8;
    local_1800 = local_2520;
    uStack_17f8 = uStack_2518;
    uStack_17f0 = uStack_2510;
    uStack_17e8 = uStack_2508;
    fStack_1804 = uStack_2408._4_4_;
    local_1820 = (local_1780 + 0.041665796) * (float)local_2420;
    fStack_181c = (fStack_177c + 0.041665796) * local_2420._4_4_;
    fStack_1818 = (fStack_1778 + 0.041665796) * (float)uStack_2418;
    fStack_1814 = (fStack_1774 + 0.041665796) * uStack_2418._4_4_;
    fStack_1810 = (fStack_1770 + 0.041665796) * (float)uStack_2410;
    fStack_180c = (fStack_176c + 0.041665796) * uStack_2410._4_4_;
    fStack_1808 = (fStack_1768 + 0.041665796) * (float)uStack_2408;
    local_1840[0] = 0.16666666;
    local_1840[1] = 0.16666666;
    afStack_1838[0] = 0.16666666;
    afStack_1838[1] = 0.16666666;
    afStack_1830[0] = 0.16666666;
    afStack_1830[1] = 0.16666666;
    afStack_1828[0] = 0.16666666;
    afStack_1828[1] = 0.16666666;
    local_25e0 = CONCAT44(fStack_181c + 0.16666666,local_1820 + 0.16666666);
    uStack_25d8 = CONCAT44(fStack_1814 + 0.16666666,fStack_1818 + 0.16666666);
    uStack_25d0 = CONCAT44(fStack_180c + 0.16666666,fStack_1810 + 0.16666666);
    uStack_25c8 = CONCAT44(uStack_2408._4_4_ + 0.16666666,fStack_1808 + 0.16666666);
    local_18f8 = ::_ps256_cephes_exp_p5;
    local_1880 = local_25e0;
    uStack_1878 = uStack_25d8;
    uStack_1870 = uStack_25d0;
    uStack_1868 = uStack_25c8;
    local_18a0 = local_2520;
    uStack_1898 = uStack_2518;
    uStack_1890 = uStack_2510;
    uStack_1888 = uStack_2508;
    fStack_18a4 = uStack_2408._4_4_;
    local_18c0 = (local_1820 + 0.16666666) * (float)local_2420;
    fStack_18bc = (fStack_181c + 0.16666666) * local_2420._4_4_;
    fStack_18b8 = (fStack_1818 + 0.16666666) * (float)uStack_2418;
    fStack_18b4 = (fStack_1814 + 0.16666666) * uStack_2418._4_4_;
    fStack_18b0 = (fStack_1810 + 0.16666666) * (float)uStack_2410;
    fStack_18ac = (fStack_180c + 0.16666666) * uStack_2410._4_4_;
    fStack_18a8 = (fStack_1808 + 0.16666666) * (float)uStack_2408;
    local_18e0[0] = 0.5;
    local_18e0[1] = 0.5;
    afStack_18d8[0] = 0.5;
    afStack_18d8[1] = 0.5;
    afStack_18d0[0] = 0.5;
    afStack_18d0[1] = 0.5;
    afStack_18c8[0] = 0.5;
    afStack_18c8[1] = 0.5;
    local_25e0 = CONCAT44(fStack_18bc + 0.5,local_18c0 + 0.5);
    uStack_25d8 = CONCAT44(fStack_18b4 + 0.5,fStack_18b8 + 0.5);
    uStack_25d0 = CONCAT44(fStack_18ac + 0.5,fStack_18b0 + 0.5);
    uStack_25c8 = CONCAT44(uStack_2408._4_4_ + 0.5,fStack_18a8 + 0.5);
    local_1990 = &local_2540;
    local_1920 = local_25e0;
    uStack_1918 = uStack_25d8;
    uStack_1910 = uStack_25d0;
    uStack_1908 = uStack_25c8;
    local_1940 = local_2540;
    uStack_1938 = uStack_2538;
    uStack_2530 = auVar58._16_8_;
    uStack_1930 = uStack_2530;
    uStack_2528 = auVar2._24_8_;
    uStack_1928 = uStack_2528;
    fStack_1944 = uStack_2408._4_4_;
    local_1960 = (local_18c0 + 0.5) * (float)local_2420 * (float)local_2420;
    fStack_195c = (fStack_18bc + 0.5) * local_2420._4_4_ * local_2420._4_4_;
    fStack_1958 = (fStack_18b8 + 0.5) * (float)uStack_2418 * (float)uStack_2418;
    fStack_1954 = (fStack_18b4 + 0.5) * uStack_2418._4_4_ * uStack_2418._4_4_;
    fStack_1950 = (fStack_18b0 + 0.5) * (float)uStack_2410 * (float)uStack_2410;
    fStack_194c = (fStack_18ac + 0.5) * uStack_2410._4_4_ * uStack_2410._4_4_;
    fStack_1948 = (fStack_18a8 + 0.5) * (float)uStack_2408 * (float)uStack_2408;
    local_1980 = local_2520;
    uStack_1978 = uStack_2518;
    uStack_1970 = uStack_2510;
    uStack_1968 = uStack_2508;
    local_25e0 = CONCAT44(fStack_195c + local_2420._4_4_,local_1960 + (float)local_2420);
    uStack_25d8 = CONCAT44(fStack_1954 + uStack_2418._4_4_,fStack_1958 + (float)uStack_2418);
    uStack_25d0 = CONCAT44(fStack_194c + uStack_2410._4_4_,fStack_1950 + (float)uStack_2410);
    uStack_25c8 = CONCAT44(uStack_2408._4_4_ + uStack_2408._4_4_,fStack_1948 + (float)uStack_2408);
    local_24e0 = local_25e0;
    uStack_24d8 = uStack_25d8;
    uStack_24d0 = uStack_25d0;
    uStack_24c8 = uStack_25c8;
    local_2500 = 0x3f8000003f800000;
    uStack_24f8 = 0x3f8000003f800000;
    uStack_24f0 = 0x3f8000003f800000;
    uStack_24e8 = 0x3f8000003f800000;
    fVar61 = local_1960 + (float)local_2420 + 1.0;
    fVar62 = fStack_195c + local_2420._4_4_ + 1.0;
    fVar63 = fStack_1958 + (float)uStack_2418 + 1.0;
    fVar64 = fStack_1954 + uStack_2418._4_4_ + 1.0;
    fVar65 = fStack_1950 + (float)uStack_2410 + 1.0;
    fVar66 = fStack_194c + uStack_2410._4_4_ + 1.0;
    fVar59 = fStack_1948 + (float)uStack_2408 + 1.0;
    fVar60 = uStack_2408._4_4_ + uStack_2408._4_4_ + 1.0;
    local_25e0 = CONCAT44(fVar62,fVar61);
    uStack_25d8 = CONCAT44(fVar64,fVar63);
    uStack_25d0 = CONCAT44(fVar66,fVar65);
    uStack_25c8 = CONCAT44(fVar60,fVar59);
    local_1260 = local_2560;
    uStack_1258 = uStack_2558;
    uStack_1250 = uStack_2550;
    uStack_1248 = uStack_2548;
    local_2580 = CONCAT44((int)local_1280._4_4_,(int)(float)local_1280);
    uStack_2578 = CONCAT44((int)uStack_1278._4_4_,(int)(float)uStack_1278);
    uStack_2570 = CONCAT44((int)uStack_1270._4_4_,(int)(float)uStack_1270);
    uStack_2568 = CONCAT44((int)uStack_1268._4_4_,(int)(float)uStack_1268);
    local_1160 = local_2580;
    uStack_1158 = uStack_2578;
    uStack_1150 = uStack_2570;
    uStack_1148 = uStack_2568;
    local_1200 = local_2580;
    uStack_11f8 = uStack_2578;
    uStack_11f0 = uStack_2570;
    uStack_11e8 = uStack_2568;
    local_1220 = 0x7f0000007f;
    uStack_1218 = 0x7f0000007f;
    uStack_1210 = 0x7f0000007f;
    uStack_1208 = 0x7f0000007f;
    local_11b0 = 0x7f0000007f;
    uStack_11a8 = 0x7f0000007f;
    local_11c0 = 0x7f0000007f;
    uStack_11b8 = 0x7f0000007f;
    local_1030 = local_2580;
    uStack_1028 = uStack_2578;
    local_1040 = 0x7f0000007f;
    uStack_1038 = 0x7f0000007f;
    auVar32._8_8_ = uStack_2578;
    auVar32._0_8_ = local_2580;
    auVar5._8_8_ = 0x7f0000007f;
    auVar5._0_8_ = 0x7f0000007f;
    local_1190 = vpaddd_avx(auVar32,auVar5);
    local_1050 = uStack_2570;
    uStack_1048 = uStack_2568;
    local_1060 = 0x7f0000007f;
    uStack_1058 = 0x7f0000007f;
    auVar4._8_8_ = uStack_2568;
    auVar4._0_8_ = uStack_2570;
    auVar1._8_8_ = 0x7f0000007f;
    auVar1._0_8_ = 0x7f0000007f;
    local_11a0 = vpaddd_avx(auVar4,auVar1);
    local_1240 = local_1190._0_8_;
    uStack_1238 = local_1190._8_8_;
    uStack_1230 = local_11a0._0_8_;
    uStack_1228 = local_11a0._8_8_;
    local_11e0 = local_1190._0_8_;
    uStack_11d8 = local_1190._8_8_;
    uStack_11d0 = local_11a0._0_8_;
    uStack_11c8 = local_11a0._8_8_;
    local_10a0 = local_1190._0_8_;
    uStack_1098 = local_1190._8_8_;
    uStack_1090 = local_11a0._0_8_;
    uStack_1088 = local_11a0._8_8_;
    local_10a4 = 0x17;
    local_1120 = local_1190._0_8_;
    uStack_1118 = local_1190._8_8_;
    uStack_1110 = local_11a0._0_8_;
    uStack_1108 = local_11a0._8_8_;
    local_ff0 = local_1190._0_8_;
    uStack_fe8 = local_1190._8_8_;
    local_ff4 = 0x17;
    local_10c0 = vpslld_avx(local_1190,ZEXT416(0x17));
    local_1010 = local_11a0._0_8_;
    uStack_1008 = local_11a0._8_8_;
    local_1014 = 0x17;
    local_10d0 = vpslld_avx(local_11a0,ZEXT416(0x17));
    local_1140 = local_10c0._0_8_;
    uStack_1138 = local_10c0._8_8_;
    uStack_1130 = local_10d0._0_8_;
    uStack_1128 = local_10d0._8_8_;
    local_1100 = local_10c0._0_8_;
    uStack_10f8 = local_10c0._8_8_;
    uStack_10f0 = local_10d0._0_8_;
    uStack_10e8 = local_10d0._8_8_;
    local_2580 = local_10c0._0_8_;
    uStack_2578 = local_10c0._8_8_;
    uStack_2570 = local_10d0._0_8_;
    uStack_2568 = local_10d0._8_8_;
    local_1080 = local_10c0._0_8_;
    uStack_1078 = local_10c0._8_8_;
    uStack_1070 = local_10d0._0_8_;
    uStack_1068 = local_10d0._8_8_;
    local_2600 = local_10c0._0_8_;
    uStack_25f8 = local_10c0._8_8_;
    uStack_25f0 = local_10d0._0_8_;
    uStack_25e8 = local_10d0._8_8_;
    local_2460 = local_25e0;
    uStack_2458 = uStack_25d8;
    uStack_2450 = uStack_25d0;
    uStack_2448 = uStack_25c8;
    local_2480._0_4_ = local_10c0._0_4_;
    local_2480._4_4_ = local_10c0._4_4_;
    uStack_2478._0_4_ = local_10c0._8_4_;
    uStack_2478._4_4_ = local_10c0._12_4_;
    uStack_2470._0_4_ = local_10d0._0_4_;
    uStack_2470._4_4_ = local_10d0._4_4_;
    uStack_2468._0_4_ = local_10d0._8_4_;
    local_25e0 = CONCAT44(fVar62 * local_2480._4_4_,fVar61 * (float)local_2480);
    uStack_25d8 = CONCAT44(fVar64 * uStack_2478._4_4_,fVar63 * (float)uStack_2478);
    uStack_25d0 = CONCAT44(fVar66 * uStack_2470._4_4_,fVar65 * (float)uStack_2470);
    uStack_25c8 = CONCAT44(fVar60,fVar59 * (float)uStack_2468);
    local_2820 = local_25e0;
    uStack_2818 = uStack_25d8;
    uStack_2810 = uStack_25d0;
    uStack_2808 = uStack_25c8;
    local_2738 = local_2788;
    local_2760 = local_25e0;
    uStack_2758 = uStack_25d8;
    uStack_2750 = uStack_25d0;
    uStack_2748 = uStack_25c8;
    *(undefined8 *)local_2788 = local_25e0;
    *(undefined8 *)(local_2788 + 2) = uStack_25d8;
    *(undefined8 *)(local_2788 + 4) = uStack_25d0;
    *(undefined8 *)(local_2788 + 6) = uStack_25c8;
    local_2778 = local_2778 + 1;
    local_2788 = local_2788 + 8;
    local_2660 = local_2800;
    uStack_2658 = uStack_27f8;
    uStack_2650 = uStack_27f0;
    uStack_2648 = uStack_27e8;
    local_2640 = local_2380;
    uStack_2638 = uStack_2378;
    uStack_2630 = uStack_2370;
    uStack_2628 = uStack_2368;
    local_2620 = local_2680;
    uStack_2618 = uStack_2678;
    uStack_2610 = uStack_2670;
    uStack_2608 = uStack_2668;
    _local_2540 = auVar2;
    local_2480 = local_10c0._0_8_;
    uStack_2478 = local_10c0._8_8_;
    uStack_2470 = local_10d0._0_8_;
    uStack_2468 = local_10d0._8_8_;
    local_2420 = local_2440;
    uStack_2418 = uStack_2438;
    uStack_2410 = uStack_2430;
    uStack_2408 = uStack_2428;
    local_22c0 = local_25a0;
    uStack_22b8 = uStack_2598;
    uStack_22b0 = uStack_2590;
    uStack_22a8 = uStack_2588;
    _local_2280 = auVar23;
    local_2260 = uVar15;
    uStack_2258 = uVar16;
    uStack_2250 = uVar17;
    uStack_2248 = uVar18;
    local_2220 = local_2340._0_8_;
    uStack_2218 = local_2340._8_8_;
    uStack_2210 = local_2340._16_8_;
    uStack_2208 = local_2340._24_8_;
    local_2200 = uVar11;
    uStack_21f8 = uVar12;
    uStack_21f0 = uVar13;
    uStack_21e8 = uVar14;
    local_21c0 = uVar7;
    uStack_21b8 = uVar8;
    uStack_21b0 = uVar9;
    uStack_21a8 = uVar10;
    local_2080 = local_20a0;
    uStack_2078 = uStack_2098;
    uStack_2070 = uStack_2090;
    uStack_2068 = uStack_2088;
    uStack_2030 = uStack_27f0;
    uStack_2028 = uStack_27e8;
    local_1f28 = local_1fc8;
    local_1ec0 = local_2300;
    uStack_1eb8 = uStack_22f8;
    uStack_1eb0 = uStack_22f0;
    uStack_1ea8 = uStack_22e8;
    local_1e90 = local_1fd8;
    local_1e88 = local_1f38;
    fStack_1e44 = fStack_2344;
    local_1df0 = local_1fd8;
    local_1de8 = local_1f38;
    fStack_1da4 = fStack_2344;
    local_1d50 = local_1fd8;
    local_1d48 = local_1f38;
    fStack_1d04 = fStack_2344;
    local_1cb0 = local_1fd8;
    local_1ca8 = local_1f38;
    fStack_1c64 = fStack_2344;
    local_1c10 = local_1fd8;
    local_1c08 = local_1f38;
    fStack_1bc4 = fStack_2344;
    local_1b70 = local_1fd8;
    local_1b68 = local_1f38;
    fStack_1b24 = fStack_2344;
    local_1ad0 = local_1fd8;
    local_1ac8 = local_1f38;
    fStack_1a84 = fStack_2344;
    local_1a30 = local_1fd8;
    local_1a28 = local_1f38;
    fStack_19e4 = fStack_2344;
    local_18f0 = local_1998;
    local_18e8 = local_1988;
    local_1850 = local_1998;
    local_1848 = local_1988;
    local_17b0 = local_1998;
    local_17a8 = local_1988;
    local_1710 = local_1998;
    local_1708 = local_1988;
    local_1670 = local_1998;
    local_1668 = local_1988;
    local_15c8 = local_1998;
    local_1560 = uVar19;
    uStack_1558 = uVar20;
    uStack_1550 = uVar21;
    uStack_1548 = uVar22;
    local_1438 = local_1f38;
    fStack_1404 = fStack_2344;
    local_1398 = local_1998;
    local_12f8 = local_1998;
    local_12e8 = local_1388;
    local_1280 = local_2560;
    uStack_1278 = uStack_2558;
    uStack_1270 = uStack_2550;
    uStack_1268 = uStack_2548;
    local_dc0 = local_1180;
    uStack_db8 = uStack_1178;
    uStack_db0 = uStack_1170;
    uStack_da8 = uStack_1168;
  }
  for (; local_278c = in_ECX, local_279c + 3 < in_ECX; local_279c = local_279c + 4) {
    local_2730 = local_2778;
    local_2830 = *(undefined8 *)*local_2778;
    uStack_2828 = *(undefined8 *)(*local_2778 + 8);
    local_26a0 = local_2791;
    local_26a8 = &local_2830;
    local_26b0 = &local_27b0;
    local_ce0 = local_2850;
    uStack_cd8 = uStack_2848;
    local_c70 = 0x3f8000003f800000;
    uStack_c68 = 0x3f8000003f800000;
    local_8f0 = 0;
    uStack_8e8 = 0;
    local_c0 = 0;
    uStack_b8 = 0;
    local_a90 = vcmpps_avx(*(undefined1 (*) [16])*local_2778,ZEXT816(0),2);
    local_950 = 0x80000000800000;
    uStack_948 = 0x80000000800000;
    auVar45._8_8_ = 0x80000000800000;
    auVar45._0_8_ = 0x80000000800000;
    auVar1 = vmaxps_avx(*(undefined1 (*) [16])*local_2778,auVar45);
    local_a60 = auVar1._0_8_;
    local_a0 = local_a60;
    uStack_a58 = auVar1._8_8_;
    uStack_98 = uStack_a58;
    local_920 = local_a60;
    uStack_918 = uStack_a58;
    local_924 = 0x17;
    auVar5 = vpsrld_avx(auVar1,ZEXT416(0x17));
    local_820 = local_a60;
    uStack_818 = uStack_a58;
    local_830 = 0x807fffff807fffff;
    uStack_828 = 0x807fffff807fffff;
    auVar50._8_8_ = 0x807fffff807fffff;
    auVar50._0_8_ = 0x807fffff807fffff;
    auVar1 = vpand_avx(auVar1,auVar50);
    local_a60 = auVar1._0_8_;
    local_60 = local_a60;
    uStack_a58 = auVar1._8_8_;
    uStack_58 = uStack_a58;
    local_c00 = 0x3f0000003f000000;
    uStack_bf8 = 0x3f0000003f000000;
    auVar56._8_8_ = 0x3f0000003f000000;
    auVar56._0_8_ = 0x3f0000003f000000;
    auVar4 = vpor_avx(auVar1,auVar56);
    local_a70._0_8_ = auVar5._0_8_;
    local_900 = local_a70._0_8_;
    local_a70._8_8_ = auVar5._8_8_;
    uStack_8f8 = local_a70._8_8_;
    local_b20 = 0x7f0000007f;
    uStack_b18 = 0x7f0000007f;
    auVar46._8_8_ = 0x7f0000007f;
    auVar46._0_8_ = 0x7f0000007f;
    local_a70 = vpsubd_avx(auVar5,auVar46);
    local_8b0 = local_a70._0_8_;
    uStack_8a8 = local_a70._8_8_;
    auVar1 = vcvtdq2ps_avx(local_a70);
    local_aa0 = auVar1._0_8_;
    uVar7 = local_aa0;
    uStack_a98 = auVar1._8_8_;
    uVar8 = uStack_a98;
    local_a10 = 0x3f8000003f800000;
    uStack_a08 = 0x3f8000003f800000;
    local_a00._0_4_ = auVar1._0_4_;
    local_a00._4_4_ = auVar1._4_4_;
    uStack_9f8._0_4_ = auVar1._8_4_;
    uStack_9f8._4_4_ = auVar1._12_4_;
    local_aa0._4_4_ = local_a00._4_4_ + 1.0;
    local_aa0._0_4_ = (float)local_a00 + 1.0;
    uStack_a98._0_4_ = (float)uStack_9f8 + 1.0;
    uStack_a98._4_4_ = uStack_9f8._4_4_ + 1.0;
    local_a60 = auVar4._0_8_;
    local_40 = local_a60;
    uStack_a58 = auVar4._8_8_;
    uStack_38 = uStack_a58;
    local_50 = 0x3f3504f33f3504f3;
    uStack_48 = 0x3f3504f33f3504f3;
    auVar57._8_8_ = 0x3f3504f33f3504f3;
    auVar57._0_8_ = 0x3f3504f33f3504f3;
    local_ab0 = vcmpps_avx(auVar4,auVar57,1);
    local_840 = local_a60;
    uStack_838 = uStack_a58;
    local_850 = local_ab0._0_8_;
    uStack_848 = local_ab0._8_8_;
    local_ac0 = vpand_avx(auVar4,local_ab0);
    local_9c0 = local_a60;
    uStack_9b8 = uStack_a58;
    local_9d0 = 0x3f8000003f800000;
    uStack_9c8 = 0x3f8000003f800000;
    auVar44._8_8_ = 0x3f8000003f800000;
    auVar44._0_8_ = 0x3f8000003f800000;
    auVar1 = vsubps_avx(auVar4,auVar44);
    local_9e0 = local_aa0;
    uStack_9d8 = uStack_a98;
    local_860 = 0x3f8000003f800000;
    uStack_858 = 0x3f8000003f800000;
    local_870 = local_ab0._0_8_;
    uStack_868 = local_ab0._8_8_;
    auVar49._8_8_ = 0x3f8000003f800000;
    auVar49._0_8_ = 0x3f8000003f800000;
    local_9f0 = vpand_avx(auVar49,local_ab0);
    auVar43._8_8_ = uStack_a98;
    auVar43._0_8_ = local_aa0;
    _local_aa0 = vsubps_avx(auVar43,local_9f0);
    local_a60 = auVar1._0_8_;
    uVar9 = local_a60;
    uStack_a58 = auVar1._8_8_;
    uVar10 = uStack_a58;
    local_a20._0_4_ = auVar1._0_4_;
    local_a20._4_4_ = auVar1._4_4_;
    uStack_a18._0_4_ = auVar1._8_4_;
    uStack_a18._4_4_ = auVar1._12_4_;
    local_a30._0_4_ = local_ac0._0_4_;
    local_a30._4_4_ = local_ac0._4_4_;
    uStack_a28._0_4_ = local_ac0._8_4_;
    uStack_a28._4_4_ = local_ac0._12_4_;
    local_a20._0_4_ = (float)local_a20 + (float)local_a30;
    local_a20._4_4_ = local_a20._4_4_ + local_a30._4_4_;
    uStack_a18._0_4_ = (float)uStack_a18 + (float)uStack_a28;
    uStack_a18._4_4_ = uStack_a18._4_4_ + uStack_a28._4_4_;
    local_a60._4_4_ = local_a20._4_4_;
    local_a60._0_4_ = (float)local_a20;
    uStack_a58._0_4_ = (float)uStack_a18;
    uStack_a58._4_4_ = uStack_a18._4_4_;
    local_970 = local_a60;
    uStack_968 = uStack_a58;
    local_ad0 = (float)local_a20 * (float)local_a20;
    fStack_acc = local_a20._4_4_ * local_a20._4_4_;
    fStack_ac8 = (float)uStack_a18 * (float)uStack_a18;
    fStack_ac4 = uStack_a18._4_4_ * uStack_a18._4_4_;
    local_7e8 = local_ae0;
    local_6c8 = local_a60;
    local_368 = ::_ps_cephes_log_p1;
    local_320 = 0x3d9021bb3d9021bb;
    uStack_318 = 0x3d9021bb3d9021bb;
    local_330 = local_a60;
    uStack_328 = uStack_a58;
    local_340 = (float)local_a20 * 0.070376836;
    fStack_33c = local_a20._4_4_ * 0.070376836;
    fStack_338 = (float)uStack_a18 * 0.070376836;
    fStack_334 = uStack_a18._4_4_ * 0.070376836;
    local_350[0] = -0.1151461;
    local_350[1] = -0.1151461;
    afStack_348[0] = -0.1151461;
    afStack_348[1] = -0.1151461;
    local_ae0._4_4_ = fStack_33c + -0.1151461;
    local_ae0._0_4_ = local_340 + -0.1151461;
    uStack_ad8._0_4_ = fStack_338 + -0.1151461;
    uStack_ad8._4_4_ = fStack_334 + -0.1151461;
    local_3c8 = ::_ps_cephes_log_p2;
    local_380 = local_ae0;
    uStack_378 = uStack_ad8;
    local_390 = local_a60;
    uStack_388 = uStack_a58;
    local_3a0 = (local_340 + -0.1151461) * (float)local_a20;
    fStack_39c = (fStack_33c + -0.1151461) * local_a20._4_4_;
    fStack_398 = (fStack_338 + -0.1151461) * (float)uStack_a18;
    fStack_394 = (fStack_334 + -0.1151461) * uStack_a18._4_4_;
    local_3b0[0] = 0.116769984;
    local_3b0[1] = 0.116769984;
    afStack_3a8[0] = 0.116769984;
    afStack_3a8[1] = 0.116769984;
    local_ae0._4_4_ = fStack_39c + 0.116769984;
    local_ae0._0_4_ = local_3a0 + 0.116769984;
    uStack_ad8._0_4_ = fStack_398 + 0.116769984;
    uStack_ad8._4_4_ = fStack_394 + 0.116769984;
    local_428 = ::_ps_cephes_log_p3;
    local_3e0 = local_ae0;
    uStack_3d8 = uStack_ad8;
    local_3f0 = local_a60;
    uStack_3e8 = uStack_a58;
    local_400 = (local_3a0 + 0.116769984) * (float)local_a20;
    fStack_3fc = (fStack_39c + 0.116769984) * local_a20._4_4_;
    fStack_3f8 = (fStack_398 + 0.116769984) * (float)uStack_a18;
    fStack_3f4 = (fStack_394 + 0.116769984) * uStack_a18._4_4_;
    local_410[0] = -0.12420141;
    local_410[1] = -0.12420141;
    afStack_408[0] = -0.12420141;
    afStack_408[1] = -0.12420141;
    local_ae0._4_4_ = fStack_3fc + -0.12420141;
    local_ae0._0_4_ = local_400 + -0.12420141;
    uStack_ad8._0_4_ = fStack_3f8 + -0.12420141;
    uStack_ad8._4_4_ = fStack_3f4 + -0.12420141;
    local_488 = ::_ps_cephes_log_p4;
    local_440 = local_ae0;
    uStack_438 = uStack_ad8;
    local_450 = local_a60;
    uStack_448 = uStack_a58;
    local_460 = (local_400 + -0.12420141) * (float)local_a20;
    fStack_45c = (fStack_3fc + -0.12420141) * local_a20._4_4_;
    fStack_458 = (fStack_3f8 + -0.12420141) * (float)uStack_a18;
    fStack_454 = (fStack_3f4 + -0.12420141) * uStack_a18._4_4_;
    local_470[0] = 0.14249323;
    local_470[1] = 0.14249323;
    afStack_468[0] = 0.14249323;
    afStack_468[1] = 0.14249323;
    local_ae0._4_4_ = fStack_45c + 0.14249323;
    local_ae0._0_4_ = local_460 + 0.14249323;
    uStack_ad8._0_4_ = fStack_458 + 0.14249323;
    uStack_ad8._4_4_ = fStack_454 + 0.14249323;
    local_4e8 = ::_ps_cephes_log_p5;
    local_4a0 = local_ae0;
    uStack_498 = uStack_ad8;
    local_4b0 = local_a60;
    uStack_4a8 = uStack_a58;
    local_4c0 = (local_460 + 0.14249323) * (float)local_a20;
    fStack_4bc = (fStack_45c + 0.14249323) * local_a20._4_4_;
    fStack_4b8 = (fStack_458 + 0.14249323) * (float)uStack_a18;
    fStack_4b4 = (fStack_454 + 0.14249323) * uStack_a18._4_4_;
    local_4d0[0] = -0.16668057;
    local_4d0[1] = -0.16668057;
    afStack_4c8[0] = -0.16668057;
    afStack_4c8[1] = -0.16668057;
    local_ae0._4_4_ = fStack_4bc + -0.16668057;
    local_ae0._0_4_ = local_4c0 + -0.16668057;
    uStack_ad8._0_4_ = fStack_4b8 + -0.16668057;
    uStack_ad8._4_4_ = fStack_4b4 + -0.16668057;
    local_548 = ::_ps_cephes_log_p6;
    local_500 = local_ae0;
    uStack_4f8 = uStack_ad8;
    local_510 = local_a60;
    uStack_508 = uStack_a58;
    local_520 = (local_4c0 + -0.16668057) * (float)local_a20;
    fStack_51c = (fStack_4bc + -0.16668057) * local_a20._4_4_;
    fStack_518 = (fStack_4b8 + -0.16668057) * (float)uStack_a18;
    fStack_514 = (fStack_4b4 + -0.16668057) * uStack_a18._4_4_;
    local_530[0] = 0.20000714;
    local_530[1] = 0.20000714;
    afStack_528[0] = 0.20000714;
    afStack_528[1] = 0.20000714;
    local_ae0._4_4_ = fStack_51c + 0.20000714;
    local_ae0._0_4_ = local_520 + 0.20000714;
    uStack_ad8._0_4_ = fStack_518 + 0.20000714;
    uStack_ad8._4_4_ = fStack_514 + 0.20000714;
    local_5a8 = ::_ps_cephes_log_p7;
    local_560 = local_ae0;
    uStack_558 = uStack_ad8;
    local_570 = local_a60;
    uStack_568 = uStack_a58;
    local_580 = (local_520 + 0.20000714) * (float)local_a20;
    fStack_57c = (fStack_51c + 0.20000714) * local_a20._4_4_;
    fStack_578 = (fStack_518 + 0.20000714) * (float)uStack_a18;
    fStack_574 = (fStack_514 + 0.20000714) * uStack_a18._4_4_;
    local_590[0] = -0.24999994;
    local_590[1] = -0.24999994;
    afStack_588[0] = -0.24999994;
    afStack_588[1] = -0.24999994;
    local_ae0._4_4_ = fStack_57c + -0.24999994;
    local_ae0._0_4_ = local_580 + -0.24999994;
    uStack_ad8._0_4_ = fStack_578 + -0.24999994;
    uStack_ad8._4_4_ = fStack_574 + -0.24999994;
    local_608 = ::_ps_cephes_log_p8;
    local_5c0 = local_ae0;
    uStack_5b8 = uStack_ad8;
    local_5d0 = local_a60;
    uStack_5c8 = uStack_a58;
    local_5e0 = (local_580 + -0.24999994) * (float)local_a20;
    fStack_5dc = (fStack_57c + -0.24999994) * local_a20._4_4_;
    fStack_5d8 = (fStack_578 + -0.24999994) * (float)uStack_a18;
    fStack_5d4 = (fStack_574 + -0.24999994) * uStack_a18._4_4_;
    local_5f0[0] = 0.3333333;
    local_5f0[1] = 0.3333333;
    afStack_5e8[0] = 0.3333333;
    afStack_5e8[1] = 0.3333333;
    local_ae0._4_4_ = fStack_5dc + 0.3333333;
    local_ae0._0_4_ = local_5e0 + 0.3333333;
    uStack_ad8._0_4_ = fStack_5d8 + 0.3333333;
    uStack_ad8._4_4_ = fStack_5d4 + 0.3333333;
    local_980 = local_ae0;
    uStack_978 = uStack_ad8;
    local_990 = local_a60;
    uStack_988 = uStack_a58;
    local_ae0._0_4_ = (local_5e0 + 0.3333333) * (float)local_a20;
    local_ae0._4_4_ = (fStack_5dc + 0.3333333) * local_a20._4_4_;
    fVar61 = (fStack_5d8 + 0.3333333) * (float)uStack_a18;
    fVar62 = (fStack_5d4 + 0.3333333) * uStack_a18._4_4_;
    uStack_ad8._0_4_ = fVar61;
    uStack_ad8._4_4_ = fVar62;
    local_9a0 = local_ae0;
    uStack_998 = uStack_ad8;
    local_9b0 = CONCAT44(fStack_acc,local_ad0);
    uStack_9a8 = CONCAT44(fStack_ac4,fStack_ac8);
    local_ae0._0_4_ = (float)local_ae0._0_4_ * local_ad0;
    local_ae0._4_4_ = (float)local_ae0._4_4_ * fStack_acc;
    fVar61 = fVar61 * fStack_ac8;
    fVar62 = fVar62 * fStack_ac4;
    uStack_ad8._0_4_ = fVar61;
    uStack_ad8._4_4_ = fVar62;
    local_6b8 = local_aa0;
    local_660 = ::_ps_cephes_log_q1;
    local_630[0] = -0.00021219444;
    local_630[1] = -0.00021219444;
    afStack_628[0] = -0.00021219444;
    afStack_628[1] = -0.00021219444;
    local_620._0_4_ = local_aa0._0_4_;
    local_620._4_4_ = local_aa0._4_4_;
    uStack_618._0_4_ = local_aa0._8_4_;
    uStack_618._4_4_ = local_aa0._12_4_;
    local_640 = (float)local_620 * -0.00021219444;
    fStack_63c = local_620._4_4_ * -0.00021219444;
    fStack_638 = (float)uStack_618 * -0.00021219444;
    fStack_634 = uStack_618._4_4_ * -0.00021219444;
    local_650 = local_ae0;
    uStack_648 = uStack_ad8;
    local_ae0._4_4_ = fStack_63c + (float)local_ae0._4_4_;
    local_ae0._0_4_ = local_640 + (float)local_ae0._0_4_;
    uStack_ad8._0_4_ = fStack_638 + fVar61;
    uStack_ad8._4_4_ = fStack_634 + fVar62;
    local_7d8 = &local_ad0;
    local_7e0 = ::_ps_0p5;
    local_7c0 = local_ae0;
    uStack_7b8 = uStack_ad8;
    local_7a0 = CONCAT44(fStack_acc,local_ad0);
    uStack_798 = CONCAT44(fStack_ac4,fStack_ac8);
    local_7b0[0] = 0.5;
    local_7b0[1] = 0.5;
    afStack_7a8[0] = 0.5;
    afStack_7a8[1] = 0.5;
    local_7d0 = local_ad0 * 0.5;
    fStack_7cc = fStack_acc * 0.5;
    fStack_7c8 = fStack_ac8 * 0.5;
    fStack_7c4 = fStack_ac4 * 0.5;
    auVar52._4_4_ = fStack_7cc;
    auVar52._0_4_ = local_7d0;
    auVar52._8_4_ = fStack_7c8;
    auVar52._12_4_ = fStack_7c4;
    _local_ae0 = vsubps_avx(_local_ae0,auVar52);
    local_a40 = local_a60;
    uStack_a38 = uStack_a58;
    local_a50._0_4_ = local_ae0._0_4_;
    local_a50._4_4_ = local_ae0._4_4_;
    uStack_a48._0_4_ = local_ae0._8_4_;
    uStack_a48._4_4_ = local_ae0._12_4_;
    local_a60._4_4_ = local_a20._4_4_ + local_a50._4_4_;
    local_a60._0_4_ = (float)local_a20 + (float)local_a50;
    uStack_a58._0_4_ = (float)uStack_a18 + (float)uStack_a48;
    uStack_a58._4_4_ = uStack_a18._4_4_ + uStack_a48._4_4_;
    local_6c0 = ::_ps_cephes_log_q2;
    local_680 = local_aa0;
    uStack_678 = uStack_a98;
    local_690[0] = 0.6933594;
    local_690[1] = 0.6933594;
    afStack_688[0] = 0.6933594;
    afStack_688[1] = 0.6933594;
    local_6a0 = (float)local_620 * 0.6933594;
    fStack_69c = local_620._4_4_ * 0.6933594;
    fStack_698 = (float)uStack_618 * 0.6933594;
    fStack_694 = uStack_618._4_4_ * 0.6933594;
    local_6b0 = local_a60;
    uStack_6a8 = uStack_a58;
    local_a60._4_4_ = fStack_69c + local_a20._4_4_ + local_a50._4_4_;
    local_a60._0_4_ = local_6a0 + (float)local_a20 + (float)local_a50;
    uStack_a58._0_4_ = fStack_698 + (float)uStack_a18 + (float)uStack_a48;
    uStack_a58._4_4_ = fStack_694 + uStack_a18._4_4_ + uStack_a48._4_4_;
    local_80 = local_a60;
    uStack_78 = uStack_a58;
    local_90 = local_a90._0_8_;
    uStack_88 = local_a90._8_8_;
    auVar55._8_8_ = uStack_a58;
    auVar55._0_8_ = local_a60;
    _local_a60 = vpor_avx(auVar55,local_a90);
    local_cb0._0_4_ = (float)local_2850;
    local_cb0._4_4_ = (float)((ulong)local_2850 >> 0x20);
    uStack_ca8._0_4_ = (float)uStack_2848;
    uStack_ca8._4_4_ = (float)((ulong)uStack_2848 >> 0x20);
    local_cc0._0_4_ = local_a60._0_4_;
    local_cc0._4_4_ = local_a60._4_4_;
    uStack_cb8._0_4_ = local_a60._8_4_;
    uStack_cb8._4_4_ = local_a60._12_4_;
    local_c30._4_4_ = local_cb0._4_4_ * local_cc0._4_4_;
    local_c30._0_4_ = (float)local_cb0 * (float)local_cc0;
    uStack_c28._0_4_ = (float)uStack_ca8 * (float)uStack_cb8;
    uStack_c28._4_4_ = uStack_ca8._4_4_ * uStack_cb8._4_4_;
    local_8e0 = 0;
    uStack_8d8 = 0;
    local_b30 = local_c30;
    uStack_b28 = uStack_c28;
    local_b40 = 0x42b0c0a542b0c0a5;
    uStack_b38 = 0x42b0c0a542b0c0a5;
    auVar40._8_8_ = uStack_c28;
    auVar40._0_8_ = local_c30;
    auVar39._8_8_ = 0x42b0c0a542b0c0a5;
    auVar39._0_8_ = 0x42b0c0a542b0c0a5;
    auVar1 = vminps_avx(auVar40,auVar39);
    local_c30 = auVar1._0_8_;
    local_b50 = local_c30;
    uStack_c28 = auVar1._8_8_;
    uStack_b48 = uStack_c28;
    local_b60 = 0xc2b0c0a5c2b0c0a5;
    uStack_b58 = 0xc2b0c0a5c2b0c0a5;
    auVar38._8_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar5 = vmaxps_avx(auVar1,auVar38);
    local_c30 = auVar5._0_8_;
    uVar11 = local_c30;
    uStack_c28 = auVar5._8_8_;
    uVar12 = uStack_c28;
    local_b80 = 0x3fb8aa3b3fb8aa3b;
    uStack_b78 = 0x3fb8aa3b3fb8aa3b;
    local_b70._0_4_ = auVar5._0_4_;
    local_b70._4_4_ = auVar5._4_4_;
    uStack_b68._0_4_ = auVar5._8_4_;
    uStack_b68._4_4_ = auVar5._12_4_;
    local_c50._4_4_ = local_b70._4_4_ * 1.442695;
    local_c50._0_4_ = (float)local_b70 * 1.442695;
    uStack_c48._0_4_ = (float)uStack_b68 * 1.442695;
    uStack_c48._4_4_ = uStack_b68._4_4_ * 1.442695;
    local_bf0 = local_c50;
    uStack_be8 = uStack_c48;
    local_c50._0_4_ = (float)local_b70 * 1.442695 + 0.5;
    local_c50._4_4_ = local_b70._4_4_ * 1.442695 + 0.5;
    fVar61 = (float)uStack_b68 * 1.442695 + 0.5;
    fVar62 = uStack_b68._4_4_ * 1.442695 + 0.5;
    uStack_c48._0_4_ = fVar61;
    uStack_c48._4_4_ = fVar62;
    local_8c0 = local_c50;
    uStack_8b8 = uStack_c48;
    local_c60._4_4_ = (int)(float)local_c50._4_4_;
    local_c60._0_4_ = (int)(float)local_c50._0_4_;
    local_c60._8_4_ = (int)fVar61;
    local_c60._12_4_ = (int)fVar62;
    local_8a0 = local_c60._0_8_;
    uStack_898 = local_c60._8_8_;
    auVar47._8_8_ = local_c60._8_8_;
    auVar47._0_8_ = local_c60._0_8_;
    auVar4 = vcvtdq2ps_avx(auVar47);
    local_c40 = auVar4._0_8_;
    local_880 = local_c40;
    uStack_c38 = auVar4._8_8_;
    uStack_878 = uStack_c38;
    local_890 = local_c50;
    uStack_888 = uStack_c48;
    auVar48._8_8_ = uStack_c48;
    auVar48._0_8_ = local_c50;
    auVar1 = vcmpps_avx(auVar48,auVar4,1);
    local_c80._0_8_ = auVar1._0_8_;
    local_800 = local_c80._0_8_;
    local_c80._8_8_ = auVar1._8_8_;
    uStack_7f8 = local_c80._8_8_;
    local_810 = 0x3f8000003f800000;
    uStack_808 = 0x3f8000003f800000;
    auVar51._8_8_ = 0x3f8000003f800000;
    auVar51._0_8_ = 0x3f8000003f800000;
    local_c80 = vpand_avx(auVar1,auVar51);
    local_bd0 = local_c40;
    uStack_bc8 = uStack_c38;
    local_be0 = local_c80._0_8_;
    uStack_bd8 = local_c80._8_8_;
    _local_c50 = vsubps_avx(auVar4,local_c80);
    local_778 = local_c50;
    local_720 = ::_ps_cephes_exp_C1;
    local_788 = local_c30;
    local_700 = local_c30;
    uStack_6f8 = uStack_c28;
    local_6f0[0] = 0.6933594;
    local_6f0[1] = 0.6933594;
    afStack_6e8[0] = 0.6933594;
    afStack_6e8[1] = 0.6933594;
    local_6e0._0_4_ = local_c50._0_4_;
    local_6e0._4_4_ = local_c50._4_4_;
    uStack_6d8._0_4_ = local_c50._8_4_;
    uStack_6d8._4_4_ = local_c50._12_4_;
    local_710 = (float)local_6e0 * 0.6933594;
    fStack_70c = local_6e0._4_4_ * 0.6933594;
    fStack_708 = (float)uStack_6d8 * 0.6933594;
    fStack_704 = uStack_6d8._4_4_ * 0.6933594;
    auVar54._4_4_ = fStack_70c;
    auVar54._0_4_ = local_710;
    auVar54._8_4_ = fStack_708;
    auVar54._12_4_ = fStack_704;
    auVar1 = vsubps_avx(auVar5,auVar54);
    local_780 = ::_ps_cephes_exp_C2;
    local_c30 = auVar1._0_8_;
    local_760 = local_c30;
    uStack_c28 = auVar1._8_8_;
    uStack_758 = uStack_c28;
    local_740 = local_c50;
    uStack_738 = uStack_c48;
    local_750[0] = -0.00021219444;
    local_750[1] = -0.00021219444;
    afStack_748[0] = -0.00021219444;
    afStack_748[1] = -0.00021219444;
    local_770 = (float)local_6e0 * -0.00021219444;
    fStack_76c = local_6e0._4_4_ * -0.00021219444;
    fStack_768 = (float)uStack_6d8 * -0.00021219444;
    fStack_764 = uStack_6d8._4_4_ * -0.00021219444;
    auVar53._4_4_ = fStack_76c;
    auVar53._0_4_ = local_770;
    auVar53._8_4_ = fStack_768;
    auVar53._12_4_ = fStack_764;
    _local_c30 = vsubps_avx(auVar1,auVar53);
    local_ba0 = local_c30;
    uStack_b98 = uStack_c28;
    local_b90._0_4_ = local_c30._0_4_;
    local_b90._4_4_ = local_c30._4_4_;
    uStack_b88._0_4_ = local_c30._8_4_;
    uStack_b88._4_4_ = local_c30._12_4_;
    local_c40 = CONCAT44(local_b90._4_4_ * local_b90._4_4_,(float)local_b90 * (float)local_b90);
    uStack_c38._0_4_ = (float)uStack_b88 * (float)uStack_b88;
    uStack_c38._4_4_ = uStack_b88._4_4_ * uStack_b88._4_4_;
    local_2f8 = &local_c90;
    local_128 = ::_ps_cephes_exp_p1;
    local_e0 = 0x3950696739506967;
    uStack_d8 = 0x3950696739506967;
    local_f0 = local_c30;
    uStack_e8 = uStack_c28;
    local_100 = (float)local_b90 * 0.00019875691;
    fStack_fc = local_b90._4_4_ * 0.00019875691;
    fStack_f8 = (float)uStack_b88 * 0.00019875691;
    fStack_f4 = uStack_b88._4_4_ * 0.00019875691;
    local_110[0] = 0.0013981999;
    local_110[1] = 0.0013981999;
    afStack_108[0] = 0.0013981999;
    afStack_108[1] = 0.0013981999;
    local_c90 = CONCAT44(fStack_fc + 0.0013981999,local_100 + 0.0013981999);
    uStack_c88 = CONCAT44(fStack_f4 + 0.0013981999,fStack_f8 + 0.0013981999);
    local_188 = ::_ps_cephes_exp_p2;
    local_140 = local_c90;
    uStack_138 = uStack_c88;
    local_150 = local_c30;
    uStack_148 = uStack_c28;
    local_160 = (local_100 + 0.0013981999) * (float)local_b90;
    fStack_15c = (fStack_fc + 0.0013981999) * local_b90._4_4_;
    fStack_158 = (fStack_f8 + 0.0013981999) * (float)uStack_b88;
    fStack_154 = (fStack_f4 + 0.0013981999) * uStack_b88._4_4_;
    local_170[0] = 0.008333452;
    local_170[1] = 0.008333452;
    afStack_168[0] = 0.008333452;
    afStack_168[1] = 0.008333452;
    local_c90 = CONCAT44(fStack_15c + 0.008333452,local_160 + 0.008333452);
    uStack_c88 = CONCAT44(fStack_154 + 0.008333452,fStack_158 + 0.008333452);
    local_1e8 = ::_ps_cephes_exp_p3;
    local_1a0 = local_c90;
    uStack_198 = uStack_c88;
    local_1b0 = local_c30;
    uStack_1a8 = uStack_c28;
    local_1c0 = (local_160 + 0.008333452) * (float)local_b90;
    fStack_1bc = (fStack_15c + 0.008333452) * local_b90._4_4_;
    fStack_1b8 = (fStack_158 + 0.008333452) * (float)uStack_b88;
    fStack_1b4 = (fStack_154 + 0.008333452) * uStack_b88._4_4_;
    local_1d0[0] = 0.041665796;
    local_1d0[1] = 0.041665796;
    afStack_1c8[0] = 0.041665796;
    afStack_1c8[1] = 0.041665796;
    local_c90 = CONCAT44(fStack_1bc + 0.041665796,local_1c0 + 0.041665796);
    uStack_c88 = CONCAT44(fStack_1b4 + 0.041665796,fStack_1b8 + 0.041665796);
    local_248 = ::_ps_cephes_exp_p4;
    local_200 = local_c90;
    uStack_1f8 = uStack_c88;
    local_210 = local_c30;
    uStack_208 = uStack_c28;
    local_220 = (local_1c0 + 0.041665796) * (float)local_b90;
    fStack_21c = (fStack_1bc + 0.041665796) * local_b90._4_4_;
    fStack_218 = (fStack_1b8 + 0.041665796) * (float)uStack_b88;
    fStack_214 = (fStack_1b4 + 0.041665796) * uStack_b88._4_4_;
    local_230[0] = 0.16666666;
    local_230[1] = 0.16666666;
    afStack_228[0] = 0.16666666;
    afStack_228[1] = 0.16666666;
    local_c90 = CONCAT44(fStack_21c + 0.16666666,local_220 + 0.16666666);
    uStack_c88 = CONCAT44(fStack_214 + 0.16666666,fStack_218 + 0.16666666);
    local_2a8 = ::_ps_cephes_exp_p5;
    local_260 = local_c90;
    uStack_258 = uStack_c88;
    local_270 = local_c30;
    uStack_268 = uStack_c28;
    local_280 = (local_220 + 0.16666666) * (float)local_b90;
    fStack_27c = (fStack_21c + 0.16666666) * local_b90._4_4_;
    fStack_278 = (fStack_218 + 0.16666666) * (float)uStack_b88;
    fStack_274 = (fStack_214 + 0.16666666) * uStack_b88._4_4_;
    local_290[0] = 0.5;
    local_290[1] = 0.5;
    afStack_288[0] = 0.5;
    afStack_288[1] = 0.5;
    local_c90 = CONCAT44(fStack_27c + 0.5,local_280 + 0.5);
    uStack_c88 = CONCAT44(fStack_274 + 0.5,fStack_278 + 0.5);
    local_300 = &local_c40;
    local_2c0 = local_c90;
    uStack_2b8 = uStack_c88;
    local_2d0 = local_c40;
    uStack_2c8 = uStack_c38;
    local_2e0 = (local_280 + 0.5) * (float)local_b90 * (float)local_b90;
    fStack_2dc = (fStack_27c + 0.5) * local_b90._4_4_ * local_b90._4_4_;
    fStack_2d8 = (fStack_278 + 0.5) * (float)uStack_b88 * (float)uStack_b88;
    fStack_2d4 = (fStack_274 + 0.5) * uStack_b88._4_4_ * uStack_b88._4_4_;
    local_2f0 = local_c30;
    uStack_2e8 = uStack_c28;
    local_c90 = CONCAT44(fStack_2dc + local_b90._4_4_,local_2e0 + (float)local_b90);
    uStack_c88 = CONCAT44(fStack_2d4 + uStack_b88._4_4_,fStack_2d8 + (float)uStack_b88);
    local_c10 = local_c90;
    uStack_c08 = uStack_c88;
    local_c20 = 0x3f8000003f800000;
    uStack_c18 = 0x3f8000003f800000;
    fVar61 = local_2e0 + (float)local_b90 + 1.0;
    fVar62 = fStack_2dc + local_b90._4_4_ + 1.0;
    fVar63 = fStack_2d8 + (float)uStack_b88 + 1.0;
    fVar64 = fStack_2d4 + uStack_b88._4_4_ + 1.0;
    local_c90 = CONCAT44(fVar62,fVar61);
    uStack_c88 = CONCAT44(fVar64,fVar63);
    local_8d0 = local_c50;
    uStack_8c8 = uStack_c48;
    local_c60._4_4_ = (int)local_6e0._4_4_;
    local_c60._0_4_ = (int)(float)local_6e0;
    local_c60._8_4_ = (int)(float)uStack_6d8;
    local_c60._12_4_ = (int)uStack_6d8._4_4_;
    local_b10 = local_c60._0_8_;
    uStack_b08 = local_c60._8_8_;
    auVar42._8_8_ = local_c60._8_8_;
    auVar42._0_8_ = local_c60._0_8_;
    auVar41._8_8_ = 0x7f0000007f;
    auVar41._0_8_ = 0x7f0000007f;
    auVar1 = vpaddd_avx(auVar42,auVar41);
    local_c60._0_8_ = auVar1._0_8_;
    local_af0 = local_c60._0_8_;
    local_c60._8_8_ = auVar1._8_8_;
    uStack_ae8 = local_c60._8_8_;
    local_af4 = 0x17;
    local_c60 = vpslld_avx(auVar1,ZEXT416(0x17));
    local_d0 = local_c60._0_8_;
    uStack_c8 = local_c60._8_8_;
    local_ca0 = local_c60._0_8_;
    uStack_c98 = local_c60._8_8_;
    local_bb0 = local_c90;
    uStack_ba8 = uStack_c88;
    local_bc0._0_4_ = local_c60._0_4_;
    local_bc0._4_4_ = local_c60._4_4_;
    uStack_bb8._0_4_ = local_c60._8_4_;
    uStack_bb8._4_4_ = local_c60._12_4_;
    local_c90 = CONCAT44(fVar62 * local_bc0._4_4_,fVar61 * (float)local_bc0);
    uStack_c88 = CONCAT44(fVar64 * uStack_bb8._4_4_,fVar63 * (float)uStack_bb8);
    local_2708 = local_2788;
    local_2720 = local_c90;
    uStack_2718 = uStack_c88;
    *(undefined8 *)local_2788 = local_c90;
    *(undefined8 *)(local_2788 + 2) = uStack_c88;
    local_2778 = (undefined1 (*) [32])(*local_2778 + 0x10);
    local_2788 = local_2788 + 4;
    local_cd0 = local_2830;
    uStack_cc8 = uStack_2828;
    local_cc0 = local_a60;
    uStack_cb8 = uStack_a58;
    local_cb0 = local_ce0;
    uStack_ca8 = uStack_cd8;
    local_bc0 = local_c60._0_8_;
    uStack_bb8 = local_c60._8_8_;
    local_b90 = local_ba0;
    uStack_b88 = uStack_b98;
    local_b70 = uVar11;
    uStack_b68 = uVar12;
    local_a80 = local_c70;
    uStack_a78 = uStack_c68;
    local_a50 = local_ae0;
    uStack_a48 = uStack_ad8;
    local_a30 = local_ac0._0_8_;
    uStack_a28 = local_ac0._8_8_;
    local_a20 = uVar9;
    uStack_a18 = uVar10;
    local_a00 = uVar7;
    uStack_9f8 = uVar8;
    local_960 = local_970;
    uStack_958 = uStack_968;
    local_940 = local_2830;
    uStack_938 = uStack_2828;
    local_910 = local_b20;
    uStack_908 = uStack_b18;
    local_728 = local_788;
    local_718 = local_778;
    local_6e0 = local_c50;
    uStack_6d8 = uStack_c48;
    local_668 = local_7e8;
    local_658 = local_6b8;
    local_620 = local_aa0;
    uStack_618 = uStack_a98;
    local_600 = local_6c8;
    local_5f8 = local_7e8;
    local_5a0 = local_6c8;
    local_598 = local_7e8;
    local_540 = local_6c8;
    local_538 = local_7e8;
    local_4e0 = local_6c8;
    local_4d8 = local_7e8;
    local_480 = local_6c8;
    local_478 = local_7e8;
    local_420 = local_6c8;
    local_418 = local_7e8;
    local_3c0 = local_6c8;
    local_3b8 = local_7e8;
    local_360 = local_6c8;
    local_358 = local_7e8;
    local_308 = local_788;
    local_2a0 = local_788;
    local_298 = local_2f8;
    local_240 = local_788;
    local_238 = local_2f8;
    local_1e0 = local_788;
    local_1d8 = local_2f8;
    local_180 = local_788;
    local_178 = local_2f8;
    local_120 = local_788;
    local_118 = local_2f8;
    local_b0 = local_2830;
    uStack_a8 = uStack_2828;
    local_70 = local_c00;
    uStack_68 = uStack_bf8;
  }
  for (; local_279c < local_278c; local_279c = local_279c + 1) {
    local_2688 = local_2791;
    local_2690 = local_2778;
    local_2698 = &local_2798;
    fVar61 = powf(*(float *)*local_2778,local_2798);
    *local_2788 = fVar61;
    local_2778 = (undefined1 (*) [32])(*local_2778 + 4);
    local_2788 = local_2788 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_b(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float b = *ptr1;

    int i = 0;
#if __SSE2__
    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps(ptr1) : _mm_set1_ps(b);
#if __AVX__
    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps(ptr1) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps(ptr1) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_256);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b_128);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, b);
        ptr += 1;
        outptr += 1;
    }
}